

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  void *pvVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int iVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  RayQueryContext *pRVar50;
  uint uVar51;
  uint uVar52;
  ulong uVar53;
  long lVar55;
  byte bVar56;
  uint uVar57;
  uint uVar58;
  ulong uVar59;
  bool bVar60;
  ulong uVar61;
  bool bVar62;
  float fVar63;
  undefined4 uVar64;
  float fVar65;
  float fVar86;
  float fVar88;
  vint4 bi_2;
  float fVar90;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar87;
  float fVar89;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar91;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined8 uVar92;
  vint4 bi_1;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar124;
  vint4 ai_2;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar136;
  float fVar147;
  vint4 ai;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  float fVar148;
  vint4 bi;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  float fVar163;
  float fVar180;
  float fVar181;
  vfloat4 b0_1;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar182;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  float fVar193;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar186 [16];
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar194;
  undefined1 auVar192 [32];
  float fVar198;
  float fVar211;
  vint4 ai_1;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar212;
  float fVar227;
  vfloat4 a0_2;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar228;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  vfloat4 a0_3;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar247;
  float fVar260;
  float fVar261;
  vfloat4 a0_1;
  undefined1 auVar252 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar262;
  undefined1 auVar250 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar251 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  vfloat4 a0;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar273 [16];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar285 [32];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_648 [8];
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined1 local_558 [32];
  undefined1 local_508 [16];
  undefined1 (*local_4f8) [16];
  RayQueryContext *local_4f0;
  undefined1 local_4e8 [32];
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 auStack_408 [16];
  undefined1 local_3f8 [16];
  uint auStack_3e8 [4];
  RTCFilterFunctionNArguments local_3d8;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  uint local_368;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  uint local_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [32];
  undefined1 local_268 [32];
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  uint uStack_208;
  float afStack_204 [7];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_188 [16];
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar54;
  undefined1 auVar284 [32];
  
  PVar3 = prim[1];
  uVar61 = (ulong)(byte)PVar3;
  fVar63 = *(float *)(prim + uVar61 * 0x19 + 0x12);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [16])(prim + uVar61 * 0x19 + 6));
  auVar242._0_4_ = fVar63 * auVar8._0_4_;
  auVar242._4_4_ = fVar63 * auVar8._4_4_;
  auVar242._8_4_ = fVar63 * auVar8._8_4_;
  auVar242._12_4_ = fVar63 * auVar8._12_4_;
  auVar128._0_4_ = fVar63 * auVar9._0_4_;
  auVar128._4_4_ = fVar63 * auVar9._4_4_;
  auVar128._8_4_ = fVar63 * auVar9._8_4_;
  auVar128._12_4_ = fVar63 * auVar9._12_4_;
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 4 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar281 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 6 + 6)));
  auVar281 = vcvtdq2ps_avx(auVar281);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar61 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  uVar53 = (ulong)(uint)((int)(uVar61 * 9) * 2);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + uVar61 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  uVar53 = (ulong)(uint)((int)(uVar61 * 5) << 2);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + 6)));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar271._4_4_ = auVar128._0_4_;
  auVar271._0_4_ = auVar128._0_4_;
  auVar271._8_4_ = auVar128._0_4_;
  auVar271._12_4_ = auVar128._0_4_;
  auVar94 = vshufps_avx(auVar128,auVar128,0x55);
  auVar252 = vshufps_avx(auVar128,auVar128,0xaa);
  fVar63 = auVar252._0_4_;
  auVar240._0_4_ = fVar63 * auVar281._0_4_;
  fVar86 = auVar252._4_4_;
  auVar240._4_4_ = fVar86 * auVar281._4_4_;
  fVar88 = auVar252._8_4_;
  auVar240._8_4_ = fVar88 * auVar281._8_4_;
  fVar90 = auVar252._12_4_;
  auVar240._12_4_ = fVar90 * auVar281._12_4_;
  auVar229._0_4_ = auVar13._0_4_ * fVar63;
  auVar229._4_4_ = auVar13._4_4_ * fVar86;
  auVar229._8_4_ = auVar13._8_4_ * fVar88;
  auVar229._12_4_ = auVar13._12_4_ * fVar90;
  auVar199._0_4_ = auVar111._0_4_ * fVar63;
  auVar199._4_4_ = auVar111._4_4_ * fVar86;
  auVar199._8_4_ = auVar111._8_4_ * fVar88;
  auVar199._12_4_ = auVar111._12_4_ * fVar90;
  auVar252 = vfmadd231ps_fma(auVar240,auVar94,auVar9);
  auVar75 = vfmadd231ps_fma(auVar229,auVar94,auVar12);
  auVar94 = vfmadd231ps_fma(auVar199,auVar66,auVar94);
  auVar125 = vfmadd231ps_fma(auVar252,auVar271,auVar8);
  auVar75 = vfmadd231ps_fma(auVar75,auVar271,auVar11);
  auVar138 = vfmadd231ps_fma(auVar94,auVar67,auVar271);
  auVar272._4_4_ = auVar242._0_4_;
  auVar272._0_4_ = auVar242._0_4_;
  auVar272._8_4_ = auVar242._0_4_;
  auVar272._12_4_ = auVar242._0_4_;
  auVar94 = vshufps_avx(auVar242,auVar242,0x55);
  auVar252 = vshufps_avx(auVar242,auVar242,0xaa);
  fVar63 = auVar252._0_4_;
  auVar149._0_4_ = fVar63 * auVar281._0_4_;
  fVar86 = auVar252._4_4_;
  auVar149._4_4_ = fVar86 * auVar281._4_4_;
  fVar88 = auVar252._8_4_;
  auVar149._8_4_ = fVar88 * auVar281._8_4_;
  fVar90 = auVar252._12_4_;
  auVar149._12_4_ = fVar90 * auVar281._12_4_;
  auVar93._0_4_ = auVar13._0_4_ * fVar63;
  auVar93._4_4_ = auVar13._4_4_ * fVar86;
  auVar93._8_4_ = auVar13._8_4_ * fVar88;
  auVar93._12_4_ = auVar13._12_4_ * fVar90;
  auVar252._0_4_ = auVar111._0_4_ * fVar63;
  auVar252._4_4_ = auVar111._4_4_ * fVar86;
  auVar252._8_4_ = auVar111._8_4_ * fVar88;
  auVar252._12_4_ = auVar111._12_4_ * fVar90;
  auVar9 = vfmadd231ps_fma(auVar149,auVar94,auVar9);
  auVar281 = vfmadd231ps_fma(auVar93,auVar94,auVar12);
  auVar12 = vfmadd231ps_fma(auVar252,auVar94,auVar66);
  auVar13 = vfmadd231ps_fma(auVar9,auVar272,auVar8);
  auVar66 = vfmadd231ps_fma(auVar281,auVar272,auVar11);
  auVar111 = vfmadd231ps_fma(auVar12,auVar272,auVar67);
  auVar248._8_4_ = 0x7fffffff;
  auVar248._0_8_ = 0x7fffffff7fffffff;
  auVar248._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx(auVar125,auVar248);
  auVar137._8_4_ = 0x219392ef;
  auVar137._0_8_ = 0x219392ef219392ef;
  auVar137._12_4_ = 0x219392ef;
  auVar8 = vcmpps_avx(auVar8,auVar137,1);
  auVar9 = vblendvps_avx(auVar125,auVar137,auVar8);
  auVar8 = vandps_avx(auVar75,auVar248);
  auVar8 = vcmpps_avx(auVar8,auVar137,1);
  auVar281 = vblendvps_avx(auVar75,auVar137,auVar8);
  auVar8 = vandps_avx(auVar138,auVar248);
  auVar8 = vcmpps_avx(auVar8,auVar137,1);
  auVar8 = vblendvps_avx(auVar138,auVar137,auVar8);
  auVar11 = vrcpps_avx(auVar9);
  auVar183._8_4_ = 0x3f800000;
  auVar183._0_8_ = 0x3f8000003f800000;
  auVar183._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar11,auVar183);
  auVar11 = vfmadd132ps_fma(auVar9,auVar11,auVar11);
  auVar9 = vrcpps_avx(auVar281);
  auVar281 = vfnmadd213ps_fma(auVar281,auVar9,auVar183);
  auVar12 = vfmadd132ps_fma(auVar281,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar9,auVar183);
  auVar67 = vfmadd132ps_fma(auVar8,auVar9,auVar9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar61 * 7 + 6);
  auVar8 = vpmovsxwd_avx(auVar8);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar13);
  auVar138._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar138._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar138._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar138._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar61 * 9 + 6);
  auVar8 = vpmovsxwd_avx(auVar9);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar13);
  auVar150._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar150._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar150._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar150._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar75._1_3_ = 0;
  auVar75[0] = PVar3;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar281);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar61 * -2 + 6);
  auVar8 = vpmovsxwd_avx(auVar11);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar66);
  auVar200._0_4_ = auVar8._0_4_ * auVar12._0_4_;
  auVar200._4_4_ = auVar8._4_4_ * auVar12._4_4_;
  auVar200._8_4_ = auVar8._8_4_ * auVar12._8_4_;
  auVar200._12_4_ = auVar8._12_4_ * auVar12._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar9);
  auVar8 = vsubps_avx(auVar8,auVar66);
  auVar94._0_4_ = auVar12._0_4_ * auVar8._0_4_;
  auVar94._4_4_ = auVar12._4_4_ * auVar8._4_4_;
  auVar94._8_4_ = auVar12._8_4_ * auVar8._8_4_;
  auVar94._12_4_ = auVar12._12_4_ * auVar8._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar53 + uVar61 + 6);
  auVar8 = vpmovsxwd_avx(auVar12);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar111);
  auVar125._0_4_ = auVar67._0_4_ * auVar8._0_4_;
  auVar125._4_4_ = auVar67._4_4_ * auVar8._4_4_;
  auVar125._8_4_ = auVar67._8_4_ * auVar8._8_4_;
  auVar125._12_4_ = auVar67._12_4_ * auVar8._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar61 * 0x17 + 6);
  auVar8 = vpmovsxwd_avx(auVar13);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar111);
  auVar66._0_4_ = auVar67._0_4_ * auVar8._0_4_;
  auVar66._4_4_ = auVar67._4_4_ * auVar8._4_4_;
  auVar66._8_4_ = auVar67._8_4_ * auVar8._8_4_;
  auVar66._12_4_ = auVar67._12_4_ * auVar8._12_4_;
  auVar8 = vpminsd_avx(auVar138,auVar150);
  auVar9 = vpminsd_avx(auVar200,auVar94);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vpminsd_avx(auVar125,auVar66);
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar213._4_4_ = uVar64;
  auVar213._0_4_ = uVar64;
  auVar213._8_4_ = uVar64;
  auVar213._12_4_ = uVar64;
  auVar9 = vmaxps_avx(auVar9,auVar213);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  local_348._0_4_ = auVar8._0_4_ * 0.99999964;
  local_348._4_4_ = auVar8._4_4_ * 0.99999964;
  local_348._8_4_ = auVar8._8_4_ * 0.99999964;
  local_348._12_4_ = auVar8._12_4_ * 0.99999964;
  auVar8 = vpmaxsd_avx(auVar138,auVar150);
  auVar9 = vpmaxsd_avx(auVar200,auVar94);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar9 = vpmaxsd_avx(auVar125,auVar66);
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar111._4_4_ = uVar64;
  auVar111._0_4_ = uVar64;
  auVar111._8_4_ = uVar64;
  auVar111._12_4_ = uVar64;
  auVar9 = vminps_avx(auVar9,auVar111);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar67._0_4_ = auVar8._0_4_ * 1.0000004;
  auVar67._4_4_ = auVar8._4_4_ * 1.0000004;
  auVar67._8_4_ = auVar8._8_4_ * 1.0000004;
  auVar67._12_4_ = auVar8._12_4_ * 1.0000004;
  auVar75[4] = PVar3;
  auVar75._5_3_ = 0;
  auVar75[8] = PVar3;
  auVar75._9_3_ = 0;
  auVar75[0xc] = PVar3;
  auVar75._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar75,_DAT_01f7fcf0);
  auVar8 = vcmpps_avx(local_348,auVar67,2);
  auVar8 = vandps_avx(auVar8,auVar9);
  uVar51 = vmovmskps_avx(auVar8);
  if (uVar51 == 0) {
    return false;
  }
  uVar51 = uVar51 & 0xff;
  auVar83._16_16_ = mm_lookupmask_ps._240_16_;
  auVar83._0_16_ = mm_lookupmask_ps._240_16_;
  local_158 = vblendps_avx(auVar83,ZEXT832(0) << 0x20,0x80);
  local_4f8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_4f0 = context;
LAB_015d3240:
  pRVar50 = local_4f0;
  lVar55 = 0;
  uVar61 = (ulong)uVar51;
  for (uVar53 = uVar61; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    lVar55 = lVar55 + 1;
  }
  uVar51 = *(uint *)(prim + 2);
  local_368 = *(uint *)(prim + lVar55 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar51].ptr;
  uVar53 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_368);
  p_Var5 = pGVar4[1].intersectionFilterN;
  pvVar6 = pGVar4[2].userPtr;
  _Var7 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar13 = *(undefined1 (*) [16])(_Var7 + uVar53 * (long)pvVar6);
  auVar8 = *(undefined1 (*) [16])(_Var7 + (uVar53 + 1) * (long)pvVar6);
  auVar9 = *(undefined1 (*) [16])(_Var7 + (uVar53 + 2) * (long)pvVar6);
  pfVar1 = (float *)(_Var7 + (long)pvVar6 * (uVar53 + 3));
  fVar63 = *pfVar1;
  fVar86 = pfVar1[1];
  fVar88 = pfVar1[2];
  fVar90 = pfVar1[3];
  lVar55 = *(long *)&pGVar4[1].time_range.upper;
  auVar281 = *(undefined1 (*) [16])(lVar55 + (long)p_Var5 * uVar53);
  auVar11 = *(undefined1 (*) [16])(lVar55 + (long)p_Var5 * (uVar53 + 1));
  auVar12 = *(undefined1 (*) [16])(lVar55 + (long)p_Var5 * (uVar53 + 2));
  uVar61 = uVar61 - 1 & uVar61;
  pfVar1 = (float *)(lVar55 + (long)p_Var5 * (uVar53 + 3));
  fVar163 = *pfVar1;
  fVar180 = pfVar1[1];
  fVar181 = pfVar1[2];
  fVar182 = pfVar1[3];
  if (uVar61 != 0) {
    uVar59 = uVar61 - 1 & uVar61;
    for (uVar53 = uVar61; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    }
    if (uVar59 != 0) {
      for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar67 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar95._0_4_ = fVar163 * 0.0;
  auVar95._4_4_ = fVar180 * 0.0;
  auVar95._8_4_ = fVar181 * 0.0;
  auVar95._12_4_ = fVar182 * 0.0;
  auVar273._8_4_ = 0x3e2aaaab;
  auVar273._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar273._12_4_ = 0x3e2aaaab;
  auVar66 = vfmadd213ps_fma(auVar273,auVar12,auVar95);
  auVar201._8_4_ = 0x3f2aaaab;
  auVar201._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar201._12_4_ = 0x3f2aaaab;
  auVar66 = vfmadd231ps_fma(auVar66,auVar11,auVar201);
  auVar111 = vfmadd231ps_fma(auVar66,auVar281,auVar273);
  auVar68._8_4_ = 0x3f000000;
  auVar68._0_8_ = 0x3f0000003f000000;
  auVar68._12_4_ = 0x3f000000;
  auVar66 = vfmadd231ps_fma(auVar95,auVar12,auVar68);
  auVar66 = vfnmadd231ps_fma(auVar66,auVar11,ZEXT816(0) << 0x40);
  auVar252 = vfnmadd231ps_fma(auVar66,auVar281,auVar68);
  auVar249._0_4_ = fVar63 * 0.0;
  auVar249._4_4_ = fVar86 * 0.0;
  auVar249._8_4_ = fVar88 * 0.0;
  auVar249._12_4_ = fVar90 * 0.0;
  auVar66 = vfmadd213ps_fma(auVar273,auVar9,auVar249);
  auVar66 = vfmadd231ps_fma(auVar66,auVar8,auVar201);
  auVar66 = vfmadd231ps_fma(auVar66,auVar13,auVar273);
  auVar94 = vfmadd231ps_fma(auVar249,auVar9,auVar68);
  auVar94 = vfnmadd231ps_fma(auVar94,auVar8,(undefined1  [16])0x0);
  auVar75 = vfnmadd231ps_fma(auVar94,auVar13,auVar68);
  auVar126._0_4_ = fVar163 * 0.16666667;
  auVar126._4_4_ = fVar180 * 0.16666667;
  auVar126._8_4_ = fVar181 * 0.16666667;
  auVar126._12_4_ = fVar182 * 0.16666667;
  auVar94 = vfmadd231ps_fma(auVar126,auVar12,auVar201);
  auVar94 = vfmadd231ps_fma(auVar94,auVar11,auVar273);
  auVar94 = vfmadd231ps_fma(auVar94,auVar281,(undefined1  [16])0x0);
  auVar139._0_4_ = fVar163 * 0.5;
  auVar139._4_4_ = fVar180 * 0.5;
  auVar139._8_4_ = fVar181 * 0.5;
  auVar139._12_4_ = fVar182 * 0.5;
  auVar12 = vfmadd231ps_fma(auVar139,(undefined1  [16])0x0,auVar12);
  auVar11 = vfnmadd231ps_fma(auVar12,auVar68,auVar11);
  auVar125 = vfnmadd231ps_fma(auVar11,(undefined1  [16])0x0,auVar281);
  auVar214._0_4_ = fVar63 * 0.16666667;
  auVar214._4_4_ = fVar86 * 0.16666667;
  auVar214._8_4_ = fVar88 * 0.16666667;
  auVar214._12_4_ = fVar90 * 0.16666667;
  auVar112._8_4_ = 0x3f2aaaab;
  auVar112._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar112._12_4_ = 0x3f2aaaab;
  auVar281 = vfmadd231ps_fma(auVar214,auVar9,auVar112);
  auVar281 = vfmadd231ps_fma(auVar281,auVar8,auVar273);
  auVar12 = vfmadd231ps_fma(auVar281,auVar13,(undefined1  [16])0x0);
  auVar230._0_4_ = fVar63 * 0.5;
  auVar230._4_4_ = fVar86 * 0.5;
  auVar230._8_4_ = fVar88 * 0.5;
  auVar230._12_4_ = fVar90 * 0.5;
  auVar9 = vfmadd231ps_fma(auVar230,(undefined1  [16])0x0,auVar9);
  auVar8 = vfnmadd231ps_fma(auVar9,auVar68,auVar8);
  auVar13 = vfnmadd231ps_fma(auVar8,(undefined1  [16])0x0,auVar13);
  auVar8 = vshufps_avx(auVar252,auVar252,0xc9);
  auVar9 = vshufps_avx(auVar66,auVar66,0xc9);
  fVar124 = auVar252._0_4_;
  auVar164._0_4_ = fVar124 * auVar9._0_4_;
  fVar87 = auVar252._4_4_;
  auVar164._4_4_ = fVar87 * auVar9._4_4_;
  fVar89 = auVar252._8_4_;
  auVar164._8_4_ = fVar89 * auVar9._8_4_;
  fVar148 = auVar252._12_4_;
  auVar164._12_4_ = fVar148 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar164,auVar8,auVar66);
  auVar281 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar165._0_4_ = fVar124 * auVar9._0_4_;
  auVar165._4_4_ = fVar87 * auVar9._4_4_;
  auVar165._8_4_ = fVar89 * auVar9._8_4_;
  auVar165._12_4_ = fVar148 * auVar9._12_4_;
  auVar8 = vfmsub231ps_fma(auVar165,auVar8,auVar75);
  auVar11 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar125,auVar125,0xc9);
  auVar9 = vshufps_avx(auVar12,auVar12,0xc9);
  fVar65 = auVar125._0_4_;
  auVar151._0_4_ = fVar65 * auVar9._0_4_;
  fVar228 = auVar125._4_4_;
  auVar151._4_4_ = fVar228 * auVar9._4_4_;
  fVar136 = auVar125._8_4_;
  auVar151._8_4_ = fVar136 * auVar9._8_4_;
  fVar147 = auVar125._12_4_;
  auVar151._12_4_ = fVar147 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar151,auVar8,auVar12);
  auVar12 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar184._0_4_ = fVar65 * auVar9._0_4_;
  auVar184._4_4_ = fVar228 * auVar9._4_4_;
  auVar184._8_4_ = fVar136 * auVar9._8_4_;
  auVar184._12_4_ = fVar147 * auVar9._12_4_;
  auVar8 = vfmsub231ps_fma(auVar184,auVar8,auVar13);
  auVar13 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vdpps_avx(auVar281,auVar281,0x7f);
  fVar86 = auVar8._0_4_;
  auVar66 = ZEXT416((uint)fVar86);
  auVar9 = vrsqrtss_avx(auVar66,auVar66);
  fVar63 = auVar9._0_4_;
  fVar63 = fVar63 * 1.5 + fVar86 * -0.5 * fVar63 * fVar63 * fVar63;
  auVar9 = vdpps_avx(auVar281,auVar11,0x7f);
  fVar163 = auVar281._0_4_ * fVar63;
  fVar180 = auVar281._4_4_ * fVar63;
  fVar181 = auVar281._8_4_ * fVar63;
  fVar182 = auVar281._12_4_ * fVar63;
  auVar241._0_4_ = auVar11._0_4_ * fVar86;
  auVar241._4_4_ = auVar11._4_4_ * fVar86;
  auVar241._8_4_ = auVar11._8_4_ * fVar86;
  auVar241._12_4_ = auVar11._12_4_ * fVar86;
  fVar86 = auVar9._0_4_;
  auVar202._0_4_ = auVar281._0_4_ * fVar86;
  auVar202._4_4_ = auVar281._4_4_ * fVar86;
  auVar202._8_4_ = auVar281._8_4_ * fVar86;
  auVar202._12_4_ = auVar281._12_4_ * fVar86;
  auVar281 = vsubps_avx(auVar241,auVar202);
  auVar9 = vrcpss_avx(auVar66,auVar66);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar88 = auVar9._0_4_ * auVar8._0_4_;
  auVar8 = vdpps_avx(auVar12,auVar12,0x7f);
  fVar90 = auVar8._0_4_;
  auVar66 = ZEXT416((uint)fVar90);
  auVar9 = vrsqrtss_avx(auVar66,auVar66);
  fVar86 = auVar9._0_4_;
  auVar9 = vdpps_avx(auVar12,auVar13,0x7f);
  fVar86 = fVar86 * 1.5 + fVar90 * -0.5 * fVar86 * fVar86 * fVar86;
  fVar247 = fVar86 * auVar12._0_4_;
  fVar260 = fVar86 * auVar12._4_4_;
  fVar261 = fVar86 * auVar12._8_4_;
  fVar262 = fVar86 * auVar12._12_4_;
  auVar185._0_4_ = fVar90 * auVar13._0_4_;
  auVar185._4_4_ = fVar90 * auVar13._4_4_;
  auVar185._8_4_ = fVar90 * auVar13._8_4_;
  auVar185._12_4_ = fVar90 * auVar13._12_4_;
  fVar90 = auVar9._0_4_;
  auVar152._0_4_ = fVar90 * auVar12._0_4_;
  auVar152._4_4_ = fVar90 * auVar12._4_4_;
  auVar152._8_4_ = fVar90 * auVar12._8_4_;
  auVar152._12_4_ = fVar90 * auVar12._12_4_;
  auVar11 = vsubps_avx(auVar185,auVar152);
  auVar9 = vrcpss_avx(auVar66,auVar66);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar9,ZEXT416(0x40000000));
  fVar90 = auVar8._0_4_ * auVar9._0_4_;
  auVar8 = vshufps_avx(auVar111,auVar111,0xff);
  auVar215._0_4_ = auVar8._0_4_ * fVar163;
  auVar215._4_4_ = auVar8._4_4_ * fVar180;
  auVar215._8_4_ = auVar8._8_4_ * fVar181;
  auVar215._12_4_ = auVar8._12_4_ * fVar182;
  local_468 = vsubps_avx(auVar111,auVar215);
  auVar9 = vshufps_avx(auVar252,auVar252,0xff);
  auVar166._0_4_ = auVar9._0_4_ * fVar163 + fVar63 * auVar281._0_4_ * fVar88 * auVar8._0_4_;
  auVar166._4_4_ = auVar9._4_4_ * fVar180 + fVar63 * auVar281._4_4_ * fVar88 * auVar8._4_4_;
  auVar166._8_4_ = auVar9._8_4_ * fVar181 + fVar63 * auVar281._8_4_ * fVar88 * auVar8._8_4_;
  auVar166._12_4_ = auVar9._12_4_ * fVar182 + fVar63 * auVar281._12_4_ * fVar88 * auVar8._12_4_;
  auVar281 = vsubps_avx(auVar252,auVar166);
  local_478._0_4_ = auVar111._0_4_ + auVar215._0_4_;
  local_478._4_4_ = auVar111._4_4_ + auVar215._4_4_;
  fStack_470 = auVar111._8_4_ + auVar215._8_4_;
  fStack_46c = auVar111._12_4_ + auVar215._12_4_;
  auVar8 = vshufps_avx(auVar94,auVar94,0xff);
  auVar113._0_4_ = fVar247 * auVar8._0_4_;
  auVar113._4_4_ = fVar260 * auVar8._4_4_;
  auVar113._8_4_ = fVar261 * auVar8._8_4_;
  auVar113._12_4_ = fVar262 * auVar8._12_4_;
  local_488 = vsubps_avx(auVar94,auVar113);
  auVar9 = vshufps_avx(auVar125,auVar125,0xff);
  auVar96._0_4_ = fVar247 * auVar9._0_4_ + auVar8._0_4_ * fVar86 * auVar11._0_4_ * fVar90;
  auVar96._4_4_ = fVar260 * auVar9._4_4_ + auVar8._4_4_ * fVar86 * auVar11._4_4_ * fVar90;
  auVar96._8_4_ = fVar261 * auVar9._8_4_ + auVar8._8_4_ * fVar86 * auVar11._8_4_ * fVar90;
  auVar96._12_4_ = fVar262 * auVar9._12_4_ + auVar8._12_4_ * fVar86 * auVar11._12_4_ * fVar90;
  auVar8 = vsubps_avx(auVar125,auVar96);
  fVar163 = auVar94._0_4_ + auVar113._0_4_;
  fVar180 = auVar94._4_4_ + auVar113._4_4_;
  fVar181 = auVar94._8_4_ + auVar113._8_4_;
  fVar182 = auVar94._12_4_ + auVar113._12_4_;
  local_498._0_4_ = local_468._0_4_ + auVar281._0_4_ * 0.33333334;
  local_498._4_4_ = local_468._4_4_ + auVar281._4_4_ * 0.33333334;
  local_498._8_4_ = local_468._8_4_ + auVar281._8_4_ * 0.33333334;
  local_498._12_4_ = local_468._12_4_ + auVar281._12_4_ * 0.33333334;
  auVar97._0_4_ = auVar8._0_4_ * 0.33333334;
  auVar97._4_4_ = auVar8._4_4_ * 0.33333334;
  auVar97._8_4_ = auVar8._8_4_ * 0.33333334;
  auVar97._12_4_ = auVar8._12_4_ * 0.33333334;
  local_4a8 = vsubps_avx(local_488,auVar97);
  local_448 = vsubps_avx(local_468,auVar67);
  auVar8 = vshufps_avx(local_448,local_448,0x55);
  auVar9 = vshufps_avx(local_448,local_448,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar63 = pre->ray_space[k].vz.field_0.m128[0];
  fVar86 = pre->ray_space[k].vz.field_0.m128[1];
  fVar88 = pre->ray_space[k].vz.field_0.m128[2];
  fVar90 = pre->ray_space[k].vz.field_0.m128[3];
  auVar98._0_4_ = fVar63 * auVar9._0_4_;
  auVar98._4_4_ = fVar86 * auVar9._4_4_;
  auVar98._8_4_ = fVar88 * auVar9._8_4_;
  auVar98._12_4_ = fVar90 * auVar9._12_4_;
  auVar281 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar2,auVar8);
  local_458 = vsubps_avx(local_498,auVar67);
  auVar8 = vshufps_avx(local_458,local_458,0x55);
  auVar9 = vshufps_avx(local_458,local_458,0xaa);
  auVar279._0_4_ = fVar63 * auVar9._0_4_;
  auVar279._4_4_ = fVar86 * auVar9._4_4_;
  auVar279._8_4_ = fVar88 * auVar9._8_4_;
  auVar279._12_4_ = fVar90 * auVar9._12_4_;
  auVar9 = vfmadd231ps_fma(auVar279,(undefined1  [16])aVar2,auVar8);
  local_2d8 = vsubps_avx(local_4a8,auVar67);
  auVar8 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar250._0_4_ = fVar63 * auVar8._0_4_;
  auVar250._4_4_ = fVar86 * auVar8._4_4_;
  auVar250._8_4_ = fVar88 * auVar8._8_4_;
  auVar250._12_4_ = fVar90 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_2d8,local_2d8,0x55);
  auVar11 = vfmadd231ps_fma(auVar250,(undefined1  [16])aVar2,auVar8);
  local_2e8 = vsubps_avx(local_488,auVar67);
  auVar8 = vshufps_avx(local_2e8,local_2e8,0xaa);
  auVar263._0_4_ = fVar63 * auVar8._0_4_;
  auVar263._4_4_ = fVar86 * auVar8._4_4_;
  auVar263._8_4_ = fVar88 * auVar8._8_4_;
  auVar263._12_4_ = fVar90 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_2e8,local_2e8,0x55);
  auVar12 = vfmadd231ps_fma(auVar263,(undefined1  [16])aVar2,auVar8);
  local_2f8 = vsubps_avx(_local_478,auVar67);
  auVar8 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar153._0_4_ = fVar63 * auVar8._0_4_;
  auVar153._4_4_ = fVar86 * auVar8._4_4_;
  auVar153._8_4_ = fVar88 * auVar8._8_4_;
  auVar153._12_4_ = fVar90 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_2f8,local_2f8,0x55);
  auVar13 = vfmadd231ps_fma(auVar153,(undefined1  [16])aVar2,auVar8);
  local_4b8._0_4_ = (fVar124 + auVar166._0_4_) * 0.33333334 + (float)local_478._0_4_;
  local_4b8._4_4_ = (fVar87 + auVar166._4_4_) * 0.33333334 + (float)local_478._4_4_;
  fStack_4b0 = (fVar89 + auVar166._8_4_) * 0.33333334 + fStack_470;
  fStack_4ac = (fVar148 + auVar166._12_4_) * 0.33333334 + fStack_46c;
  local_308 = vsubps_avx(_local_4b8,auVar67);
  auVar8 = vshufps_avx(local_308,local_308,0xaa);
  auVar203._0_4_ = auVar8._0_4_ * fVar63;
  auVar203._4_4_ = auVar8._4_4_ * fVar86;
  auVar203._8_4_ = auVar8._8_4_ * fVar88;
  auVar203._12_4_ = auVar8._12_4_ * fVar90;
  auVar8 = vshufps_avx(local_308,local_308,0x55);
  auVar66 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar2,auVar8);
  auVar216._0_4_ = (fVar65 + auVar96._0_4_) * 0.33333334;
  auVar216._4_4_ = (fVar228 + auVar96._4_4_) * 0.33333334;
  auVar216._8_4_ = (fVar136 + auVar96._8_4_) * 0.33333334;
  auVar216._12_4_ = (fVar147 + auVar96._12_4_) * 0.33333334;
  auVar44._4_4_ = fVar180;
  auVar44._0_4_ = fVar163;
  auVar44._8_4_ = fVar181;
  auVar44._12_4_ = fVar182;
  _local_4c8 = vsubps_avx(auVar44,auVar216);
  local_318 = vsubps_avx(_local_4c8,auVar67);
  auVar8 = vshufps_avx(local_318,local_318,0xaa);
  auVar217._0_4_ = auVar8._0_4_ * fVar63;
  auVar217._4_4_ = auVar8._4_4_ * fVar86;
  auVar217._8_4_ = auVar8._8_4_ * fVar88;
  auVar217._12_4_ = auVar8._12_4_ * fVar90;
  auVar8 = vshufps_avx(local_318,local_318,0x55);
  auVar111 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar2,auVar8);
  local_328 = vsubps_avx(auVar44,auVar67);
  auVar8 = vshufps_avx(local_328,local_328,0xaa);
  auVar69._0_4_ = fVar63 * auVar8._0_4_;
  auVar69._4_4_ = fVar86 * auVar8._4_4_;
  auVar69._8_4_ = fVar88 * auVar8._8_4_;
  auVar69._12_4_ = fVar90 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_328,local_328,0x55);
  auVar8 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar2,auVar8);
  auVar167._4_4_ = local_448._0_4_;
  auVar167._0_4_ = local_448._0_4_;
  auVar167._8_4_ = local_448._0_4_;
  auVar167._12_4_ = local_448._0_4_;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar67 = vfmadd231ps_fma(auVar281,(undefined1  [16])aVar2,auVar167);
  auVar168._4_4_ = local_458._0_4_;
  auVar168._0_4_ = local_458._0_4_;
  auVar168._8_4_ = local_458._0_4_;
  auVar168._12_4_ = local_458._0_4_;
  auVar94 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar168);
  uVar64 = local_2d8._0_4_;
  auVar169._4_4_ = uVar64;
  auVar169._0_4_ = uVar64;
  auVar169._8_4_ = uVar64;
  auVar169._12_4_ = uVar64;
  auVar252 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar2,auVar169);
  uVar64 = local_2e8._0_4_;
  auVar170._4_4_ = uVar64;
  auVar170._0_4_ = uVar64;
  auVar170._8_4_ = uVar64;
  auVar170._12_4_ = uVar64;
  auVar75 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar170);
  uVar64 = local_2f8._0_4_;
  auVar171._4_4_ = uVar64;
  auVar171._0_4_ = uVar64;
  auVar171._8_4_ = uVar64;
  auVar171._12_4_ = uVar64;
  auVar13 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar2,auVar171);
  uVar64 = local_308._0_4_;
  auVar172._4_4_ = uVar64;
  auVar172._0_4_ = uVar64;
  auVar172._8_4_ = uVar64;
  auVar172._12_4_ = uVar64;
  auVar66 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar2,auVar172);
  uVar64 = local_318._0_4_;
  auVar173._4_4_ = uVar64;
  auVar173._0_4_ = uVar64;
  auVar173._8_4_ = uVar64;
  auVar173._12_4_ = uVar64;
  auVar111 = vfmadd231ps_fma(auVar111,(undefined1  [16])aVar2,auVar173);
  uVar64 = local_328._0_4_;
  auVar174._4_4_ = uVar64;
  auVar174._0_4_ = uVar64;
  auVar174._8_4_ = uVar64;
  auVar174._12_4_ = uVar64;
  auVar125 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar2,auVar174);
  auVar11 = vmovlhps_avx(auVar67,auVar13);
  auVar12 = vmovlhps_avx(auVar94,auVar66);
  local_3f8 = vmovlhps_avx(auVar252,auVar111);
  _local_2c8 = vmovlhps_avx(auVar75,auVar125);
  auVar8 = vminps_avx(auVar11,auVar12);
  auVar9 = vminps_avx(local_3f8,_local_2c8);
  auVar281 = vminps_avx(auVar8,auVar9);
  auVar8 = vmaxps_avx(auVar11,auVar12);
  auVar9 = vmaxps_avx(local_3f8,_local_2c8);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vshufpd_avx(auVar281,auVar281,3);
  auVar281 = vminps_avx(auVar281,auVar9);
  auVar9 = vshufpd_avx(auVar8,auVar8,3);
  auVar9 = vmaxps_avx(auVar8,auVar9);
  auVar8 = vandps_avx(auVar248,auVar281);
  auVar9 = vandps_avx(auVar248,auVar9);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vmovshdup_avx(auVar8);
  auVar8 = vmaxss_avx(auVar9,auVar8);
  fVar86 = auVar8._0_4_ * 9.536743e-07;
  auVar186._8_8_ = auVar67._0_8_;
  auVar186._0_8_ = auVar67._0_8_;
  auVar231._8_8_ = auVar94._0_8_;
  auVar231._0_8_ = auVar94._0_8_;
  auVar251._0_8_ = auVar252._0_8_;
  auVar251._8_8_ = auVar251._0_8_;
  auVar264._0_8_ = auVar75._0_8_;
  auVar264._8_8_ = auVar264._0_8_;
  local_248 = -fVar86;
  fStack_244 = local_248;
  fStack_240 = local_248;
  fStack_23c = local_248;
  fStack_238 = local_248;
  fStack_234 = local_248;
  fStack_230 = local_248;
  fStack_22c = local_248;
  local_358 = uVar51;
  uStack_354 = uVar51;
  uStack_350 = uVar51;
  uStack_34c = uVar51;
  uStack_364 = local_368;
  uStack_360 = local_368;
  uStack_35c = local_368;
  bVar60 = false;
  uVar53 = 0;
  fVar63 = *(float *)(ray + k * 4 + 0x30);
  local_298 = vsubps_avx(auVar12,auVar11);
  local_2a8 = vsubps_avx(local_3f8,auVar12);
  local_2b8 = vsubps_avx(_local_2c8,local_3f8);
  local_378 = vsubps_avx(_local_478,local_468);
  local_388 = vsubps_avx(_local_4b8,local_498);
  local_398 = vsubps_avx(_local_4c8,local_4a8);
  auVar45._4_4_ = fVar180;
  auVar45._0_4_ = fVar163;
  auVar45._8_4_ = fVar181;
  auVar45._12_4_ = fVar182;
  _local_3a8 = vsubps_avx(auVar45,local_488);
  auVar70 = ZEXT816(0x3f80000000000000);
  local_228 = fVar86;
  fStack_224 = fVar86;
  fStack_220 = fVar86;
  fStack_21c = fVar86;
  fStack_218 = fVar86;
  fStack_214 = fVar86;
  fStack_210 = fVar86;
  fStack_20c = fVar86;
  local_338 = auVar70;
LAB_015d3a25:
  auVar8 = vshufps_avx(auVar70,auVar70,0x50);
  auVar280._8_4_ = 0x3f800000;
  auVar280._0_8_ = 0x3f8000003f800000;
  auVar280._12_4_ = 0x3f800000;
  auVar284._16_4_ = 0x3f800000;
  auVar284._0_16_ = auVar280;
  auVar284._20_4_ = 0x3f800000;
  auVar284._24_4_ = 0x3f800000;
  auVar284._28_4_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar280,auVar8);
  fVar88 = auVar8._0_4_;
  fVar136 = auVar13._0_4_;
  auVar71._0_4_ = fVar136 * fVar88;
  fVar90 = auVar8._4_4_;
  fVar147 = auVar13._4_4_;
  auVar71._4_4_ = fVar147 * fVar90;
  fVar124 = auVar8._8_4_;
  auVar71._8_4_ = fVar136 * fVar124;
  fVar87 = auVar8._12_4_;
  auVar71._12_4_ = fVar147 * fVar87;
  fVar247 = auVar66._0_4_;
  auVar175._0_4_ = fVar247 * fVar88;
  fVar260 = auVar66._4_4_;
  auVar175._4_4_ = fVar260 * fVar90;
  auVar175._8_4_ = fVar247 * fVar124;
  auVar175._12_4_ = fVar260 * fVar87;
  fVar198 = auVar111._0_4_;
  auVar140._0_4_ = fVar198 * fVar88;
  fVar211 = auVar111._4_4_;
  auVar140._4_4_ = fVar211 * fVar90;
  auVar140._8_4_ = fVar198 * fVar124;
  auVar140._12_4_ = fVar211 * fVar87;
  fVar212 = auVar125._0_4_;
  auVar114._0_4_ = fVar212 * fVar88;
  fVar227 = auVar125._4_4_;
  auVar114._4_4_ = fVar227 * fVar90;
  auVar114._8_4_ = fVar212 * fVar124;
  auVar114._12_4_ = fVar227 * fVar87;
  auVar94 = vfmadd231ps_fma(auVar71,auVar9,auVar186);
  auVar252 = vfmadd231ps_fma(auVar175,auVar9,auVar231);
  auVar75 = vfmadd231ps_fma(auVar140,auVar9,auVar251);
  auVar138 = vfmadd231ps_fma(auVar114,auVar264,auVar9);
  auVar8 = vmovshdup_avx(local_338);
  fVar88 = local_338._0_4_;
  fStack_e0 = (auVar8._0_4_ - fVar88) * 0.04761905;
  auVar225._4_4_ = fVar88;
  auVar225._0_4_ = fVar88;
  auVar225._8_4_ = fVar88;
  auVar225._12_4_ = fVar88;
  auVar225._16_4_ = fVar88;
  auVar225._20_4_ = fVar88;
  auVar225._24_4_ = fVar88;
  auVar225._28_4_ = fVar88;
  auVar107._0_8_ = auVar8._0_8_;
  auVar107._8_8_ = auVar107._0_8_;
  auVar107._16_8_ = auVar107._0_8_;
  auVar107._24_8_ = auVar107._0_8_;
  auVar83 = vsubps_avx(auVar107,auVar225);
  uVar64 = auVar94._0_4_;
  auVar277._4_4_ = uVar64;
  auVar277._0_4_ = uVar64;
  auVar277._8_4_ = uVar64;
  auVar277._12_4_ = uVar64;
  auVar277._16_4_ = uVar64;
  auVar277._20_4_ = uVar64;
  auVar277._24_4_ = uVar64;
  auVar277._28_4_ = uVar64;
  auVar8 = vmovshdup_avx(auVar94);
  uVar92 = auVar8._0_8_;
  auVar270._8_8_ = uVar92;
  auVar270._0_8_ = uVar92;
  auVar270._16_8_ = uVar92;
  auVar270._24_8_ = uVar92;
  fVar261 = auVar252._0_4_;
  auVar257._4_4_ = fVar261;
  auVar257._0_4_ = fVar261;
  auVar257._8_4_ = fVar261;
  auVar257._12_4_ = fVar261;
  auVar257._16_4_ = fVar261;
  auVar257._20_4_ = fVar261;
  auVar257._24_4_ = fVar261;
  auVar257._28_4_ = fVar261;
  auVar9 = vmovshdup_avx(auVar252);
  auVar108._0_8_ = auVar9._0_8_;
  auVar108._8_8_ = auVar108._0_8_;
  auVar108._16_8_ = auVar108._0_8_;
  auVar108._24_8_ = auVar108._0_8_;
  fVar228 = auVar75._0_4_;
  auVar190._4_4_ = fVar228;
  auVar190._0_4_ = fVar228;
  auVar190._8_4_ = fVar228;
  auVar190._12_4_ = fVar228;
  auVar190._16_4_ = fVar228;
  auVar190._20_4_ = fVar228;
  auVar190._24_4_ = fVar228;
  auVar190._28_4_ = fVar228;
  auVar281 = vmovshdup_avx(auVar75);
  auVar209._0_8_ = auVar281._0_8_;
  auVar209._8_8_ = auVar209._0_8_;
  auVar209._16_8_ = auVar209._0_8_;
  auVar209._24_8_ = auVar209._0_8_;
  fVar65 = auVar138._0_4_;
  auVar67 = vmovshdup_avx(auVar138);
  auVar242 = vfmadd132ps_fma(auVar83,auVar225,_DAT_01faff20);
  auVar83 = vsubps_avx(auVar284,ZEXT1632(auVar242));
  fVar88 = auVar242._0_4_;
  fVar90 = auVar242._4_4_;
  auVar14._4_4_ = fVar261 * fVar90;
  auVar14._0_4_ = fVar261 * fVar88;
  fVar124 = auVar242._8_4_;
  auVar14._8_4_ = fVar261 * fVar124;
  fVar87 = auVar242._12_4_;
  auVar14._12_4_ = fVar261 * fVar87;
  auVar14._16_4_ = fVar261 * 0.0;
  auVar14._20_4_ = fVar261 * 0.0;
  auVar14._24_4_ = fVar261 * 0.0;
  auVar14._28_4_ = 0x3f800000;
  auVar242 = vfmadd231ps_fma(auVar14,auVar83,auVar277);
  fVar89 = auVar9._0_4_;
  fVar148 = auVar9._4_4_;
  auVar15._4_4_ = fVar148 * fVar90;
  auVar15._0_4_ = fVar89 * fVar88;
  auVar15._8_4_ = fVar89 * fVar124;
  auVar15._12_4_ = fVar148 * fVar87;
  auVar15._16_4_ = fVar89 * 0.0;
  auVar15._20_4_ = fVar148 * 0.0;
  auVar15._24_4_ = fVar89 * 0.0;
  auVar15._28_4_ = uVar64;
  auVar93 = vfmadd231ps_fma(auVar15,auVar83,auVar270);
  auVar16._4_4_ = fVar228 * fVar90;
  auVar16._0_4_ = fVar228 * fVar88;
  auVar16._8_4_ = fVar228 * fVar124;
  auVar16._12_4_ = fVar228 * fVar87;
  auVar16._16_4_ = fVar228 * 0.0;
  auVar16._20_4_ = fVar228 * 0.0;
  auVar16._24_4_ = fVar228 * 0.0;
  auVar16._28_4_ = auVar8._4_4_;
  auVar137 = vfmadd231ps_fma(auVar16,auVar83,auVar257);
  fVar89 = auVar281._0_4_;
  fVar148 = auVar281._4_4_;
  auVar10._4_4_ = fVar148 * fVar90;
  auVar10._0_4_ = fVar89 * fVar88;
  auVar10._8_4_ = fVar89 * fVar124;
  auVar10._12_4_ = fVar148 * fVar87;
  auVar10._16_4_ = fVar89 * 0.0;
  auVar10._20_4_ = fVar148 * 0.0;
  auVar10._24_4_ = fVar89 * 0.0;
  auVar10._28_4_ = fVar261;
  auVar128 = vfmadd231ps_fma(auVar10,auVar83,auVar108);
  auVar8 = vshufps_avx(auVar94,auVar94,0xaa);
  local_558._8_8_ = auVar8._0_8_;
  local_558._0_8_ = local_558._8_8_;
  local_558._16_8_ = local_558._8_8_;
  local_558._24_8_ = local_558._8_8_;
  auVar9 = vshufps_avx(auVar94,auVar94,0xff);
  uStack_640 = auVar9._0_8_;
  local_648 = (undefined1  [8])uStack_640;
  uStack_638 = uStack_640;
  uStack_630 = uStack_640;
  auVar17._4_4_ = fVar65 * fVar90;
  auVar17._0_4_ = fVar65 * fVar88;
  auVar17._8_4_ = fVar65 * fVar124;
  auVar17._12_4_ = fVar65 * fVar87;
  auVar17._16_4_ = fVar65 * 0.0;
  auVar17._20_4_ = fVar65 * 0.0;
  auVar17._24_4_ = fVar65 * 0.0;
  auVar17._28_4_ = fVar65;
  auVar94 = vfmadd231ps_fma(auVar17,auVar83,auVar190);
  auVar9 = vshufps_avx(auVar252,auVar252,0xaa);
  auVar191._0_8_ = auVar9._0_8_;
  auVar191._8_8_ = auVar191._0_8_;
  auVar191._16_8_ = auVar191._0_8_;
  auVar191._24_8_ = auVar191._0_8_;
  auVar281 = vshufps_avx(auVar252,auVar252,0xff);
  local_4e8._8_8_ = auVar281._0_8_;
  local_4e8._0_8_ = local_4e8._8_8_;
  local_4e8._16_8_ = local_4e8._8_8_;
  local_4e8._24_8_ = local_4e8._8_8_;
  fVar89 = auVar67._0_4_;
  fVar148 = auVar67._4_4_;
  auVar18._4_4_ = fVar148 * fVar90;
  auVar18._0_4_ = fVar89 * fVar88;
  auVar18._8_4_ = fVar89 * fVar124;
  auVar18._12_4_ = fVar148 * fVar87;
  auVar18._16_4_ = fVar89 * 0.0;
  auVar18._20_4_ = fVar148 * 0.0;
  auVar18._24_4_ = fVar89 * 0.0;
  auVar18._28_4_ = auVar8._4_4_;
  auVar149 = vfmadd231ps_fma(auVar18,auVar83,auVar209);
  auVar259._28_4_ = fVar148;
  auVar259._0_28_ =
       ZEXT1628(CONCAT412(auVar137._12_4_ * fVar87,
                          CONCAT48(auVar137._8_4_ * fVar124,
                                   CONCAT44(auVar137._4_4_ * fVar90,auVar137._0_4_ * fVar88))));
  auVar242 = vfmadd231ps_fma(auVar259,auVar83,ZEXT1632(auVar242));
  fVar89 = auVar281._4_4_;
  auVar20._28_4_ = fVar89;
  auVar20._0_28_ =
       ZEXT1628(CONCAT412(auVar128._12_4_ * fVar87,
                          CONCAT48(auVar128._8_4_ * fVar124,
                                   CONCAT44(auVar128._4_4_ * fVar90,auVar128._0_4_ * fVar88))));
  auVar93 = vfmadd231ps_fma(auVar20,auVar83,ZEXT1632(auVar93));
  auVar8 = vshufps_avx(auVar75,auVar75,0xaa);
  uVar92 = auVar8._0_8_;
  auVar179._8_8_ = uVar92;
  auVar179._0_8_ = uVar92;
  auVar179._16_8_ = uVar92;
  auVar179._24_8_ = uVar92;
  auVar67 = vshufps_avx(auVar75,auVar75,0xff);
  uVar92 = auVar67._0_8_;
  auVar285._8_8_ = uVar92;
  auVar285._0_8_ = uVar92;
  auVar285._16_8_ = uVar92;
  auVar285._24_8_ = uVar92;
  auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar94._12_4_ * fVar87,
                                               CONCAT48(auVar94._8_4_ * fVar124,
                                                        CONCAT44(auVar94._4_4_ * fVar90,
                                                                 auVar94._0_4_ * fVar88)))),auVar83,
                            ZEXT1632(auVar137));
  auVar94 = vshufps_avx(auVar138,auVar138,0xaa);
  auVar252 = vshufps_avx(auVar138,auVar138,0xff);
  auVar138 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar149._12_4_,
                                                CONCAT48(fVar124 * auVar149._8_4_,
                                                         CONCAT44(fVar90 * auVar149._4_4_,
                                                                  fVar88 * auVar149._0_4_)))),
                             auVar83,ZEXT1632(auVar128));
  auVar137 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar75._12_4_,
                                                CONCAT48(fVar124 * auVar75._8_4_,
                                                         CONCAT44(fVar90 * auVar75._4_4_,
                                                                  fVar88 * auVar75._0_4_)))),auVar83
                             ,ZEXT1632(auVar242));
  auVar14 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar242));
  auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar138._12_4_,
                                               CONCAT48(fVar124 * auVar138._8_4_,
                                                        CONCAT44(fVar90 * auVar138._4_4_,
                                                                 fVar88 * auVar138._0_4_)))),auVar83
                            ,ZEXT1632(auVar93));
  auVar15 = vsubps_avx(ZEXT1632(auVar138),ZEXT1632(auVar93));
  fStack_41c = auVar15._28_4_;
  auVar258._0_4_ = fStack_e0 * auVar14._0_4_ * 3.0;
  auVar258._4_4_ = fStack_e0 * auVar14._4_4_ * 3.0;
  auVar258._8_4_ = fStack_e0 * auVar14._8_4_ * 3.0;
  auVar258._12_4_ = fStack_e0 * auVar14._12_4_ * 3.0;
  auVar258._16_4_ = fStack_e0 * auVar14._16_4_ * 3.0;
  auVar258._20_4_ = fStack_e0 * auVar14._20_4_ * 3.0;
  auVar258._24_4_ = fStack_e0 * auVar14._24_4_ * 3.0;
  auVar258._28_4_ = 0;
  local_438._0_4_ = fStack_e0 * auVar15._0_4_ * 3.0;
  local_438._4_4_ = fStack_e0 * auVar15._4_4_ * 3.0;
  fStack_430 = fStack_e0 * auVar15._8_4_ * 3.0;
  fStack_42c = fStack_e0 * auVar15._12_4_ * 3.0;
  fStack_428 = fStack_e0 * auVar15._16_4_ * 3.0;
  fStack_424 = fStack_e0 * auVar15._20_4_ * 3.0;
  fStack_420 = fStack_e0 * auVar15._24_4_ * 3.0;
  fVar148 = auVar9._0_4_;
  fVar65 = auVar9._4_4_;
  auVar21._4_4_ = fVar65 * fVar90;
  auVar21._0_4_ = fVar148 * fVar88;
  auVar21._8_4_ = fVar148 * fVar124;
  auVar21._12_4_ = fVar65 * fVar87;
  auVar21._16_4_ = fVar148 * 0.0;
  auVar21._20_4_ = fVar65 * 0.0;
  auVar21._24_4_ = fVar148 * 0.0;
  auVar21._28_4_ = fStack_41c;
  auVar9 = vfmadd231ps_fma(auVar21,auVar83,local_558);
  fVar148 = auVar281._0_4_;
  auVar22._4_4_ = fVar89 * fVar90;
  auVar22._0_4_ = fVar148 * fVar88;
  auVar22._8_4_ = fVar148 * fVar124;
  auVar22._12_4_ = fVar89 * fVar87;
  auVar22._16_4_ = fVar148 * 0.0;
  auVar22._20_4_ = fVar89 * 0.0;
  auVar22._24_4_ = fVar148 * 0.0;
  auVar22._28_4_ = 0;
  auVar281 = vfmadd231ps_fma(auVar22,auVar83,_local_648);
  fVar89 = auVar8._0_4_;
  fVar148 = auVar8._4_4_;
  auVar23._4_4_ = fVar148 * fVar90;
  auVar23._0_4_ = fVar89 * fVar88;
  auVar23._8_4_ = fVar89 * fVar124;
  auVar23._12_4_ = fVar148 * fVar87;
  auVar23._16_4_ = fVar89 * 0.0;
  auVar23._20_4_ = fVar148 * 0.0;
  auVar23._24_4_ = fVar89 * 0.0;
  auVar23._28_4_ = auVar14._28_4_;
  auVar8 = vfmadd231ps_fma(auVar23,auVar83,auVar191);
  fVar89 = auVar67._0_4_;
  fVar228 = auVar67._4_4_;
  auVar24._4_4_ = fVar228 * fVar90;
  auVar24._0_4_ = fVar89 * fVar88;
  auVar24._8_4_ = fVar89 * fVar124;
  auVar24._12_4_ = fVar228 * fVar87;
  auVar24._16_4_ = fVar89 * 0.0;
  auVar24._20_4_ = fVar228 * 0.0;
  auVar24._24_4_ = fVar89 * 0.0;
  auVar24._28_4_ = fVar65;
  auVar67 = vfmadd231ps_fma(auVar24,auVar83,local_4e8);
  local_4e8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar137));
  fVar89 = auVar94._0_4_;
  fVar148 = auVar94._4_4_;
  auVar25._4_4_ = fVar148 * fVar90;
  auVar25._0_4_ = fVar89 * fVar88;
  auVar25._8_4_ = fVar89 * fVar124;
  auVar25._12_4_ = fVar148 * fVar87;
  auVar25._16_4_ = fVar89 * 0.0;
  auVar25._20_4_ = fVar148 * 0.0;
  auVar25._24_4_ = fVar89 * 0.0;
  auVar25._28_4_ = fVar148;
  auVar94 = vfmadd231ps_fma(auVar25,auVar83,auVar179);
  auVar17 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar75));
  fVar89 = auVar252._0_4_;
  fVar148 = auVar252._4_4_;
  auVar26._4_4_ = fVar148 * fVar90;
  auVar26._0_4_ = fVar89 * fVar88;
  auVar26._8_4_ = fVar89 * fVar124;
  auVar26._12_4_ = fVar148 * fVar87;
  auVar26._16_4_ = fVar89 * 0.0;
  auVar26._20_4_ = fVar148 * 0.0;
  auVar26._24_4_ = fVar89 * 0.0;
  auVar26._28_4_ = fVar148;
  auVar252 = vfmadd231ps_fma(auVar26,auVar83,auVar285);
  auVar27._28_4_ = fVar228;
  auVar27._0_28_ =
       ZEXT1628(CONCAT412(auVar8._12_4_ * fVar87,
                          CONCAT48(auVar8._8_4_ * fVar124,
                                   CONCAT44(auVar8._4_4_ * fVar90,auVar8._0_4_ * fVar88))));
  auVar9 = vfmadd231ps_fma(auVar27,auVar83,ZEXT1632(auVar9));
  auVar281 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar67._12_4_,
                                                CONCAT48(fVar124 * auVar67._8_4_,
                                                         CONCAT44(fVar90 * auVar67._4_4_,
                                                                  fVar88 * auVar67._0_4_)))),auVar83
                             ,ZEXT1632(auVar281));
  auVar109._0_4_ = auVar137._0_4_ + auVar258._0_4_;
  auVar109._4_4_ = auVar137._4_4_ + auVar258._4_4_;
  auVar109._8_4_ = auVar137._8_4_ + auVar258._8_4_;
  auVar109._12_4_ = auVar137._12_4_ + auVar258._12_4_;
  auVar109._16_4_ = auVar258._16_4_ + 0.0;
  auVar109._20_4_ = auVar258._20_4_ + 0.0;
  auVar109._24_4_ = auVar258._24_4_ + 0.0;
  auVar109._28_4_ = 0;
  auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar94._12_4_ * fVar87,
                                              CONCAT48(auVar94._8_4_ * fVar124,
                                                       CONCAT44(auVar94._4_4_ * fVar90,
                                                                auVar94._0_4_ * fVar88)))),auVar83,
                           ZEXT1632(auVar8));
  auVar67 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar252._12_4_ * fVar87,
                                               CONCAT48(auVar252._8_4_ * fVar124,
                                                        CONCAT44(auVar252._4_4_ * fVar90,
                                                                 auVar252._0_4_ * fVar88)))),auVar83
                            ,ZEXT1632(auVar67));
  auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar8._12_4_,
                                               CONCAT48(fVar124 * auVar8._8_4_,
                                                        CONCAT44(fVar90 * auVar8._4_4_,
                                                                 fVar88 * auVar8._0_4_)))),auVar83,
                            ZEXT1632(auVar9));
  auVar252 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar67._12_4_ * fVar87,
                                                CONCAT48(auVar67._8_4_ * fVar124,
                                                         CONCAT44(auVar67._4_4_ * fVar90,
                                                                  auVar67._0_4_ * fVar88)))),
                             ZEXT1632(auVar281),auVar83);
  auVar83 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar14 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar281));
  auVar278._0_4_ = fStack_e0 * auVar83._0_4_ * 3.0;
  auVar278._4_4_ = fStack_e0 * auVar83._4_4_ * 3.0;
  auVar278._8_4_ = fStack_e0 * auVar83._8_4_ * 3.0;
  auVar278._12_4_ = fStack_e0 * auVar83._12_4_ * 3.0;
  auVar278._16_4_ = fStack_e0 * auVar83._16_4_ * 3.0;
  auVar278._20_4_ = fStack_e0 * auVar83._20_4_ * 3.0;
  auVar278._24_4_ = fStack_e0 * auVar83._24_4_ * 3.0;
  auVar278._28_4_ = 0;
  local_f8 = fStack_e0 * auVar14._0_4_ * 3.0;
  fStack_f4 = fStack_e0 * auVar14._4_4_ * 3.0;
  auVar28._4_4_ = fStack_f4;
  auVar28._0_4_ = local_f8;
  fStack_f0 = fStack_e0 * auVar14._8_4_ * 3.0;
  auVar28._8_4_ = fStack_f0;
  fStack_ec = fStack_e0 * auVar14._12_4_ * 3.0;
  auVar28._12_4_ = fStack_ec;
  fStack_e8 = fStack_e0 * auVar14._16_4_ * 3.0;
  auVar28._16_4_ = fStack_e8;
  fStack_e4 = fStack_e0 * auVar14._20_4_ * 3.0;
  auVar28._20_4_ = fStack_e4;
  fStack_e0 = fStack_e0 * auVar14._24_4_ * 3.0;
  auVar28._24_4_ = fStack_e0;
  auVar28._28_4_ = 0x40400000;
  _local_418 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar94));
  local_268 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar252));
  auVar83 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar137));
  auVar14 = vsubps_avx(ZEXT1632(auVar252),ZEXT1632(auVar75));
  auVar15 = vsubps_avx(_local_418,local_4e8);
  fVar261 = auVar83._0_4_ + auVar15._0_4_;
  fVar262 = auVar83._4_4_ + auVar15._4_4_;
  fVar193 = auVar83._8_4_ + auVar15._8_4_;
  fVar194 = auVar83._12_4_ + auVar15._12_4_;
  fVar195 = auVar83._16_4_ + auVar15._16_4_;
  fVar196 = auVar83._20_4_ + auVar15._20_4_;
  fVar197 = auVar83._24_4_ + auVar15._24_4_;
  auVar16 = vsubps_avx(local_268,auVar17);
  auVar84._0_4_ = auVar14._0_4_ + auVar16._0_4_;
  auVar84._4_4_ = auVar14._4_4_ + auVar16._4_4_;
  auVar84._8_4_ = auVar14._8_4_ + auVar16._8_4_;
  auVar84._12_4_ = auVar14._12_4_ + auVar16._12_4_;
  auVar84._16_4_ = auVar14._16_4_ + auVar16._16_4_;
  auVar84._20_4_ = auVar14._20_4_ + auVar16._20_4_;
  auVar84._24_4_ = auVar14._24_4_ + auVar16._24_4_;
  auVar84._28_4_ = auVar14._28_4_ + auVar16._28_4_;
  local_98 = ZEXT1632(auVar75);
  fVar88 = auVar75._0_4_;
  local_118 = (float)local_438._0_4_ + fVar88;
  fVar90 = auVar75._4_4_;
  fStack_114 = (float)local_438._4_4_ + fVar90;
  fVar124 = auVar75._8_4_;
  fStack_110 = fStack_430 + fVar124;
  fVar87 = auVar75._12_4_;
  fStack_10c = fStack_42c + fVar87;
  fStack_108 = fStack_428 + 0.0;
  fStack_104 = fStack_424 + 0.0;
  fStack_100 = fStack_420 + 0.0;
  local_288 = ZEXT1632(auVar137);
  auVar14 = vsubps_avx(local_288,auVar258);
  local_78 = vpermps_avx2(_DAT_01fec480,auVar14);
  auVar14 = vsubps_avx(local_98,_local_438);
  local_138 = vpermps_avx2(_DAT_01fec480,auVar14);
  local_b8._0_4_ = auVar94._0_4_ + auVar278._0_4_;
  local_b8._4_4_ = auVar94._4_4_ + auVar278._4_4_;
  local_b8._8_4_ = auVar94._8_4_ + auVar278._8_4_;
  local_b8._12_4_ = auVar94._12_4_ + auVar278._12_4_;
  local_b8._16_4_ = auVar278._16_4_ + 0.0;
  local_b8._20_4_ = auVar278._20_4_ + 0.0;
  local_b8._24_4_ = auVar278._24_4_ + 0.0;
  local_b8._28_4_ = 0;
  auVar226 = ZEXT3264(local_b8);
  auVar259 = ZEXT1632(auVar94);
  auVar14 = vsubps_avx(auVar259,auVar278);
  auVar18 = vpermps_avx2(_DAT_01fec480,auVar14);
  fVar89 = auVar252._0_4_;
  local_f8 = fVar89 + local_f8;
  fVar148 = auVar252._4_4_;
  fStack_f4 = fVar148 + fStack_f4;
  fVar65 = auVar252._8_4_;
  fStack_f0 = fVar65 + fStack_f0;
  fVar228 = auVar252._12_4_;
  fStack_ec = fVar228 + fStack_ec;
  fStack_e8 = fStack_e8 + 0.0;
  fStack_e4 = fStack_e4 + 0.0;
  fStack_e0 = fStack_e0 + 0.0;
  auVar14 = vsubps_avx(ZEXT1632(auVar252),auVar28);
  local_d8 = vpermps_avx2(_DAT_01fec480,auVar14);
  auVar29._4_4_ = fVar90 * fVar262;
  auVar29._0_4_ = fVar88 * fVar261;
  auVar29._8_4_ = fVar124 * fVar193;
  auVar29._12_4_ = fVar87 * fVar194;
  auVar29._16_4_ = fVar195 * 0.0;
  auVar29._20_4_ = fVar196 * 0.0;
  auVar29._24_4_ = fVar197 * 0.0;
  auVar29._28_4_ = auVar14._28_4_;
  auVar8 = vfnmadd231ps_fma(auVar29,local_288,auVar84);
  fStack_fc = fStack_41c + 0.0;
  auVar30._4_4_ = fStack_114 * fVar262;
  auVar30._0_4_ = local_118 * fVar261;
  auVar30._8_4_ = fStack_110 * fVar193;
  auVar30._12_4_ = fStack_10c * fVar194;
  auVar30._16_4_ = fStack_108 * fVar195;
  auVar30._20_4_ = fStack_104 * fVar196;
  auVar30._24_4_ = fStack_100 * fVar197;
  auVar30._28_4_ = 0;
  auVar9 = vfnmadd231ps_fma(auVar30,auVar84,auVar109);
  auVar31._4_4_ = local_138._4_4_ * fVar262;
  auVar31._0_4_ = local_138._0_4_ * fVar261;
  auVar31._8_4_ = local_138._8_4_ * fVar193;
  auVar31._12_4_ = local_138._12_4_ * fVar194;
  auVar31._16_4_ = local_138._16_4_ * fVar195;
  auVar31._20_4_ = local_138._20_4_ * fVar196;
  auVar31._24_4_ = local_138._24_4_ * fVar197;
  auVar31._28_4_ = fStack_41c + 0.0;
  auVar281 = vfnmadd231ps_fma(auVar31,local_78,auVar84);
  local_648._0_4_ = auVar17._0_4_;
  local_648._4_4_ = auVar17._4_4_;
  uStack_640._0_4_ = auVar17._8_4_;
  uStack_640._4_4_ = auVar17._12_4_;
  uStack_638._0_4_ = auVar17._16_4_;
  uStack_638._4_4_ = auVar17._20_4_;
  uStack_630._0_4_ = auVar17._24_4_;
  uStack_630._4_4_ = auVar17._28_4_;
  auVar32._4_4_ = (float)local_648._4_4_ * fVar262;
  auVar32._0_4_ = (float)local_648._0_4_ * fVar261;
  auVar32._8_4_ = (float)uStack_640 * fVar193;
  auVar32._12_4_ = uStack_640._4_4_ * fVar194;
  auVar32._16_4_ = (float)uStack_638 * fVar195;
  auVar32._20_4_ = uStack_638._4_4_ * fVar196;
  auVar32._24_4_ = (float)uStack_630 * fVar197;
  auVar32._28_4_ = uStack_630._4_4_;
  auVar67 = vfnmadd231ps_fma(auVar32,local_4e8,auVar84);
  auVar210._0_4_ = fVar89 * fVar261;
  auVar210._4_4_ = fVar148 * fVar262;
  auVar210._8_4_ = fVar65 * fVar193;
  auVar210._12_4_ = fVar228 * fVar194;
  auVar210._16_4_ = fVar195 * 0.0;
  auVar210._20_4_ = fVar196 * 0.0;
  auVar210._24_4_ = fVar197 * 0.0;
  auVar210._28_4_ = 0;
  auVar94 = vfnmadd231ps_fma(auVar210,auVar259,auVar84);
  uStack_dc = 0x40400000;
  auVar33._4_4_ = fStack_f4 * fVar262;
  auVar33._0_4_ = local_f8 * fVar261;
  auVar33._8_4_ = fStack_f0 * fVar193;
  auVar33._12_4_ = fStack_ec * fVar194;
  auVar33._16_4_ = fStack_e8 * fVar195;
  auVar33._20_4_ = fStack_e4 * fVar196;
  auVar33._24_4_ = fStack_e0 * fVar197;
  auVar33._28_4_ = local_4e8._28_4_;
  auVar75 = vfnmadd231ps_fma(auVar33,local_b8,auVar84);
  auVar34._4_4_ = local_d8._4_4_ * fVar262;
  auVar34._0_4_ = local_d8._0_4_ * fVar261;
  auVar34._8_4_ = local_d8._8_4_ * fVar193;
  auVar34._12_4_ = local_d8._12_4_ * fVar194;
  auVar34._16_4_ = local_d8._16_4_ * fVar195;
  auVar34._20_4_ = local_d8._20_4_ * fVar196;
  auVar34._24_4_ = local_d8._24_4_ * fVar197;
  auVar34._28_4_ = local_d8._28_4_;
  auVar138 = vfnmadd231ps_fma(auVar34,auVar18,auVar84);
  auVar35._4_4_ = local_268._4_4_ * fVar262;
  auVar35._0_4_ = local_268._0_4_ * fVar261;
  auVar35._8_4_ = local_268._8_4_ * fVar193;
  auVar35._12_4_ = local_268._12_4_ * fVar194;
  auVar35._16_4_ = local_268._16_4_ * fVar195;
  auVar35._20_4_ = local_268._20_4_ * fVar196;
  auVar35._24_4_ = local_268._24_4_ * fVar197;
  auVar35._28_4_ = auVar83._28_4_ + auVar15._28_4_;
  auVar242 = vfnmadd231ps_fma(auVar35,_local_418,auVar84);
  auVar14 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar83 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar15 = vminps_avx(ZEXT1632(auVar281),ZEXT1632(auVar67));
  auVar15 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(ZEXT1632(auVar281),ZEXT1632(auVar67));
  auVar83 = vmaxps_avx(auVar83,auVar14);
  auVar16 = vminps_avx(ZEXT1632(auVar94),ZEXT1632(auVar75));
  auVar14 = vmaxps_avx(ZEXT1632(auVar94),ZEXT1632(auVar75));
  auVar10 = vminps_avx(ZEXT1632(auVar138),ZEXT1632(auVar242));
  auVar16 = vminps_avx(auVar16,auVar10);
  auVar16 = vminps_avx(auVar15,auVar16);
  auVar15 = vmaxps_avx(ZEXT1632(auVar138),ZEXT1632(auVar242));
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(auVar83,auVar14);
  auVar48._4_4_ = fStack_224;
  auVar48._0_4_ = local_228;
  auVar48._8_4_ = fStack_220;
  auVar48._12_4_ = fStack_21c;
  auVar48._16_4_ = fStack_218;
  auVar48._20_4_ = fStack_214;
  auVar48._24_4_ = fStack_210;
  auVar48._28_4_ = fStack_20c;
  auVar83 = vcmpps_avx(auVar16,auVar48,2);
  auVar46._4_4_ = fStack_244;
  auVar46._0_4_ = local_248;
  auVar46._8_4_ = fStack_240;
  auVar46._12_4_ = fStack_23c;
  auVar46._16_4_ = fStack_238;
  auVar46._20_4_ = fStack_234;
  auVar46._24_4_ = fStack_230;
  auVar46._28_4_ = fStack_22c;
  auVar14 = vcmpps_avx(auVar14,auVar46,5);
  auVar83 = vandps_avx(auVar14,auVar83);
  auVar14 = local_158 & auVar83;
  _local_438 = auVar18;
  if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0x7f,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar14 >> 0xbf,0) != '\0') ||
      (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0') {
    auVar14 = vsubps_avx(local_4e8,local_288);
    auVar15 = vsubps_avx(_local_418,auVar259);
    fVar262 = auVar14._0_4_ + auVar15._0_4_;
    fVar193 = auVar14._4_4_ + auVar15._4_4_;
    fVar194 = auVar14._8_4_ + auVar15._8_4_;
    fVar195 = auVar14._12_4_ + auVar15._12_4_;
    fVar196 = auVar14._16_4_ + auVar15._16_4_;
    fVar197 = auVar14._20_4_ + auVar15._20_4_;
    fVar91 = auVar14._24_4_ + auVar15._24_4_;
    auVar16 = vsubps_avx(auVar17,local_98);
    auVar10 = vsubps_avx(local_268,ZEXT1632(auVar252));
    auVar110._0_4_ = auVar16._0_4_ + auVar10._0_4_;
    auVar110._4_4_ = auVar16._4_4_ + auVar10._4_4_;
    auVar110._8_4_ = auVar16._8_4_ + auVar10._8_4_;
    auVar110._12_4_ = auVar16._12_4_ + auVar10._12_4_;
    auVar110._16_4_ = auVar16._16_4_ + auVar10._16_4_;
    auVar110._20_4_ = auVar16._20_4_ + auVar10._20_4_;
    auVar110._24_4_ = auVar16._24_4_ + auVar10._24_4_;
    fVar261 = auVar10._28_4_;
    auVar110._28_4_ = auVar16._28_4_ + fVar261;
    auVar36._4_4_ = fVar90 * fVar193;
    auVar36._0_4_ = fVar88 * fVar262;
    auVar36._8_4_ = fVar124 * fVar194;
    auVar36._12_4_ = fVar87 * fVar195;
    auVar36._16_4_ = fVar196 * 0.0;
    auVar36._20_4_ = fVar197 * 0.0;
    auVar36._24_4_ = fVar91 * 0.0;
    auVar36._28_4_ = local_418._28_4_;
    auVar94 = vfnmadd231ps_fma(auVar36,auVar110,local_288);
    auVar37._4_4_ = fVar193 * fStack_114;
    auVar37._0_4_ = fVar262 * local_118;
    auVar37._8_4_ = fVar194 * fStack_110;
    auVar37._12_4_ = fVar195 * fStack_10c;
    auVar37._16_4_ = fVar196 * fStack_108;
    auVar37._20_4_ = fVar197 * fStack_104;
    auVar37._24_4_ = fVar91 * fStack_100;
    auVar37._28_4_ = 0;
    auVar8 = vfnmadd213ps_fma(auVar109,auVar110,auVar37);
    auVar38._4_4_ = fVar193 * local_138._4_4_;
    auVar38._0_4_ = fVar262 * local_138._0_4_;
    auVar38._8_4_ = fVar194 * local_138._8_4_;
    auVar38._12_4_ = fVar195 * local_138._12_4_;
    auVar38._16_4_ = fVar196 * local_138._16_4_;
    auVar38._20_4_ = fVar197 * local_138._20_4_;
    auVar38._24_4_ = fVar91 * local_138._24_4_;
    auVar38._28_4_ = 0;
    auVar9 = vfnmadd213ps_fma(local_78,auVar110,auVar38);
    auVar39._4_4_ = (float)local_648._4_4_ * fVar193;
    auVar39._0_4_ = (float)local_648._0_4_ * fVar262;
    auVar39._8_4_ = (float)uStack_640 * fVar194;
    auVar39._12_4_ = uStack_640._4_4_ * fVar195;
    auVar39._16_4_ = (float)uStack_638 * fVar196;
    auVar39._20_4_ = uStack_638._4_4_ * fVar197;
    auVar39._24_4_ = (float)uStack_630 * fVar91;
    auVar39._28_4_ = 0;
    auVar252 = vfnmadd231ps_fma(auVar39,auVar110,local_4e8);
    auVar134._0_4_ = fVar89 * fVar262;
    auVar134._4_4_ = fVar148 * fVar193;
    auVar134._8_4_ = fVar65 * fVar194;
    auVar134._12_4_ = fVar228 * fVar195;
    auVar134._16_4_ = fVar196 * 0.0;
    auVar134._20_4_ = fVar197 * 0.0;
    auVar134._24_4_ = fVar91 * 0.0;
    auVar134._28_4_ = 0;
    auVar75 = vfnmadd231ps_fma(auVar134,auVar110,auVar259);
    auVar40._4_4_ = fVar193 * fStack_f4;
    auVar40._0_4_ = fVar262 * local_f8;
    auVar40._8_4_ = fVar194 * fStack_f0;
    auVar40._12_4_ = fVar195 * fStack_ec;
    auVar40._16_4_ = fVar196 * fStack_e8;
    auVar40._20_4_ = fVar197 * fStack_e4;
    auVar40._24_4_ = fVar91 * fStack_e0;
    auVar40._28_4_ = fVar261;
    auVar281 = vfnmadd213ps_fma(local_b8,auVar110,auVar40);
    auVar41._4_4_ = fVar193 * local_d8._4_4_;
    auVar41._0_4_ = fVar262 * local_d8._0_4_;
    auVar41._8_4_ = fVar194 * local_d8._8_4_;
    auVar41._12_4_ = fVar195 * local_d8._12_4_;
    auVar41._16_4_ = fVar196 * local_d8._16_4_;
    auVar41._20_4_ = fVar197 * local_d8._20_4_;
    auVar41._24_4_ = fVar91 * local_d8._24_4_;
    auVar41._28_4_ = fVar261;
    auVar67 = vfnmadd213ps_fma(auVar18,auVar110,auVar41);
    auVar226 = ZEXT1664(auVar67);
    auVar42._4_4_ = local_268._4_4_ * fVar193;
    auVar42._0_4_ = local_268._0_4_ * fVar262;
    auVar42._8_4_ = local_268._8_4_ * fVar194;
    auVar42._12_4_ = local_268._12_4_ * fVar195;
    auVar42._16_4_ = local_268._16_4_ * fVar196;
    auVar42._20_4_ = local_268._20_4_ * fVar197;
    auVar42._24_4_ = local_268._24_4_ * fVar91;
    auVar42._28_4_ = auVar14._28_4_ + auVar15._28_4_;
    auVar138 = vfnmadd231ps_fma(auVar42,_local_418,auVar110);
    auVar15 = vminps_avx(ZEXT1632(auVar94),ZEXT1632(auVar8));
    auVar14 = vmaxps_avx(ZEXT1632(auVar94),ZEXT1632(auVar8));
    auVar16 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar252));
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar252));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar10 = vminps_avx(ZEXT1632(auVar75),ZEXT1632(auVar281));
    auVar15 = vmaxps_avx(ZEXT1632(auVar75),ZEXT1632(auVar281));
    auVar17 = vminps_avx(ZEXT1632(auVar67),ZEXT1632(auVar138));
    auVar10 = vminps_avx(auVar10,auVar17);
    auVar10 = vminps_avx(auVar16,auVar10);
    auVar16 = vmaxps_avx(ZEXT1632(auVar67),ZEXT1632(auVar138));
    auVar15 = vmaxps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar14,auVar15);
    auVar49._4_4_ = fStack_224;
    auVar49._0_4_ = local_228;
    auVar49._8_4_ = fStack_220;
    auVar49._12_4_ = fStack_21c;
    auVar49._16_4_ = fStack_218;
    auVar49._20_4_ = fStack_214;
    auVar49._24_4_ = fStack_210;
    auVar49._28_4_ = fStack_20c;
    auVar14 = vcmpps_avx(auVar10,auVar49,2);
    auVar47._4_4_ = fStack_244;
    auVar47._0_4_ = local_248;
    auVar47._8_4_ = fStack_240;
    auVar47._12_4_ = fStack_23c;
    auVar47._16_4_ = fStack_238;
    auVar47._20_4_ = fStack_234;
    auVar47._24_4_ = fStack_230;
    auVar47._28_4_ = fStack_22c;
    auVar15 = vcmpps_avx(auVar15,auVar47,5);
    auVar14 = vandps_avx(auVar15,auVar14);
    auVar83 = vandps_avx(local_158,auVar83);
    auVar15 = auVar83 & auVar14;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar83 = vandps_avx(auVar14,auVar83);
      uVar58 = vmovmskps_avx(auVar83);
      if (uVar58 != 0) {
        auStack_3e8[uVar53] = uVar58 & 0xff;
        uVar92 = vmovlps_avx(local_338);
        *(undefined8 *)(&uStack_208 + uVar53 * 2) = uVar92;
        uVar59 = vmovlps_avx(auVar70);
        auStack_58[uVar53] = uVar59;
        uVar53 = (ulong)((int)uVar53 + 1);
      }
    }
  }
LAB_015d3fd9:
  if ((int)uVar53 != 0) {
    uVar52 = (int)uVar53 - 1;
    uVar54 = (ulong)uVar52;
    uVar57 = auStack_3e8[uVar54];
    uVar58 = (&uStack_208)[uVar54 * 2];
    fVar88 = afStack_204[uVar54 * 2];
    iVar19 = 0;
    for (uVar59 = (ulong)uVar57; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
      iVar19 = iVar19 + 1;
    }
    uVar57 = uVar57 - 1 & uVar57;
    if (uVar57 == 0) {
      uVar53 = (ulong)uVar52;
    }
    auVar70._8_8_ = 0;
    auVar70._0_8_ = auStack_58[uVar54];
    auStack_3e8[uVar54] = uVar57;
    fVar90 = (float)(iVar19 + 1) * 0.14285715;
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar88 * (float)iVar19 * 0.14285715)),ZEXT416(uVar58),
                             ZEXT416((uint)(1.0 - (float)iVar19 * 0.14285715)));
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar88 * fVar90)),ZEXT416(uVar58),
                             ZEXT416((uint)(1.0 - fVar90)));
    fVar90 = auVar9._0_4_;
    auVar192._0_4_ = auVar8._0_4_;
    fVar88 = fVar90 - auVar192._0_4_;
    if (fVar88 < 0.16666667) {
      auVar281 = vshufps_avx(auVar70,auVar70,0x50);
      auVar99._8_4_ = 0x3f800000;
      auVar99._0_8_ = 0x3f8000003f800000;
      auVar99._12_4_ = 0x3f800000;
      auVar67 = vsubps_avx(auVar99,auVar281);
      fVar124 = auVar281._0_4_;
      auVar141._0_4_ = fVar124 * fVar136;
      fVar87 = auVar281._4_4_;
      auVar141._4_4_ = fVar87 * fVar147;
      fVar89 = auVar281._8_4_;
      auVar141._8_4_ = fVar89 * fVar136;
      fVar148 = auVar281._12_4_;
      auVar141._12_4_ = fVar148 * fVar147;
      auVar154._0_4_ = fVar124 * fVar247;
      auVar154._4_4_ = fVar87 * fVar260;
      auVar154._8_4_ = fVar89 * fVar247;
      auVar154._12_4_ = fVar148 * fVar260;
      auVar176._0_4_ = fVar124 * fVar198;
      auVar176._4_4_ = fVar87 * fVar211;
      auVar176._8_4_ = fVar89 * fVar198;
      auVar176._12_4_ = fVar148 * fVar211;
      auVar72._0_4_ = fVar124 * fVar212;
      auVar72._4_4_ = fVar87 * fVar227;
      auVar72._8_4_ = fVar89 * fVar212;
      auVar72._12_4_ = fVar148 * fVar227;
      auVar281 = vfmadd231ps_fma(auVar141,auVar67,auVar186);
      auVar94 = vfmadd231ps_fma(auVar154,auVar67,auVar231);
      auVar252 = vfmadd231ps_fma(auVar176,auVar67,auVar251);
      auVar67 = vfmadd231ps_fma(auVar72,auVar67,auVar264);
      auVar135._16_16_ = auVar281;
      auVar135._0_16_ = auVar281;
      auVar146._16_16_ = auVar94;
      auVar146._0_16_ = auVar94;
      auVar162._16_16_ = auVar252;
      auVar162._0_16_ = auVar252;
      auVar192._4_4_ = auVar192._0_4_;
      auVar192._8_4_ = auVar192._0_4_;
      auVar192._12_4_ = auVar192._0_4_;
      auVar192._20_4_ = fVar90;
      auVar192._16_4_ = fVar90;
      auVar192._24_4_ = fVar90;
      auVar192._28_4_ = fVar90;
      auVar83 = vsubps_avx(auVar146,auVar135);
      auVar94 = vfmadd213ps_fma(auVar83,auVar192,auVar135);
      auVar83 = vsubps_avx(auVar162,auVar146);
      auVar75 = vfmadd213ps_fma(auVar83,auVar192,auVar146);
      auVar281 = vsubps_avx(auVar67,auVar252);
      auVar85._16_16_ = auVar281;
      auVar85._0_16_ = auVar281;
      auVar281 = vfmadd213ps_fma(auVar85,auVar192,auVar162);
      auVar83 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar94));
      auVar67 = vfmadd213ps_fma(auVar83,auVar192,ZEXT1632(auVar94));
      auVar83 = vsubps_avx(ZEXT1632(auVar281),ZEXT1632(auVar75));
      auVar281 = vfmadd213ps_fma(auVar83,auVar192,ZEXT1632(auVar75));
      auVar83 = vsubps_avx(ZEXT1632(auVar281),ZEXT1632(auVar67));
      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar83,auVar192);
      fVar228 = auVar83._4_4_ * 3.0;
      local_4e8._0_4_ = fVar88;
      fVar124 = fVar88 * 0.33333334;
      local_268._0_8_ =
           CONCAT44(auVar93._4_4_ + fVar124 * fVar228,auVar93._0_4_ + fVar124 * auVar83._0_4_ * 3.0)
      ;
      local_268._8_4_ = auVar93._8_4_ + fVar124 * auVar83._8_4_ * 3.0;
      local_268._12_4_ = auVar93._12_4_ + fVar124 * auVar83._12_4_ * 3.0;
      auVar67 = vshufpd_avx(auVar93,auVar93,3);
      auVar94 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_438 = auVar67;
      auVar281 = vsubps_avx(auVar67,auVar93);
      _local_418 = auVar94;
      auVar252 = vsubps_avx(auVar94,(undefined1  [16])0x0);
      auVar73._0_4_ = auVar281._0_4_ + auVar252._0_4_;
      auVar73._4_4_ = auVar281._4_4_ + auVar252._4_4_;
      auVar73._8_4_ = auVar281._8_4_ + auVar252._8_4_;
      auVar73._12_4_ = auVar281._12_4_ + auVar252._12_4_;
      auVar281 = vshufps_avx(auVar93,auVar93,0xb1);
      auVar252 = vshufps_avx(local_268._0_16_,local_268._0_16_,0xb1);
      auVar274._4_4_ = auVar73._0_4_;
      auVar274._0_4_ = auVar73._0_4_;
      auVar274._8_4_ = auVar73._0_4_;
      auVar274._12_4_ = auVar73._0_4_;
      auVar75 = vshufps_avx(auVar73,auVar73,0x55);
      fVar87 = auVar75._0_4_;
      auVar74._0_4_ = fVar87 * auVar281._0_4_;
      fVar89 = auVar75._4_4_;
      auVar74._4_4_ = fVar89 * auVar281._4_4_;
      fVar148 = auVar75._8_4_;
      auVar74._8_4_ = fVar148 * auVar281._8_4_;
      fVar65 = auVar75._12_4_;
      auVar74._12_4_ = fVar65 * auVar281._12_4_;
      auVar155._0_4_ = fVar87 * auVar252._0_4_;
      auVar155._4_4_ = fVar89 * auVar252._4_4_;
      auVar155._8_4_ = fVar148 * auVar252._8_4_;
      auVar155._12_4_ = fVar65 * auVar252._12_4_;
      auVar138 = vfmadd231ps_fma(auVar74,auVar274,auVar93);
      auVar242 = vfmadd231ps_fma(auVar155,auVar274,local_268._0_16_);
      auVar252 = vshufps_avx(auVar138,auVar138,0xe8);
      auVar75 = vshufps_avx(auVar242,auVar242,0xe8);
      auVar281 = vcmpps_avx(auVar252,auVar75,1);
      uVar58 = vextractps_avx(auVar281,0);
      auVar137 = auVar242;
      if ((uVar58 & 1) == 0) {
        auVar137 = auVar138;
      }
      auVar127._0_4_ = fVar124 * auVar83._16_4_ * 3.0;
      auVar127._4_4_ = fVar124 * fVar228;
      auVar127._8_4_ = fVar124 * auVar83._24_4_ * 3.0;
      auVar127._12_4_ = fVar124 * auVar226._28_4_;
      local_288._0_16_ = vsubps_avx((undefined1  [16])0x0,auVar127);
      auVar128 = vshufps_avx(local_288._0_16_,local_288._0_16_,0xb1);
      auVar149 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar187._0_4_ = fVar87 * auVar128._0_4_;
      auVar187._4_4_ = fVar89 * auVar128._4_4_;
      auVar187._8_4_ = fVar148 * auVar128._8_4_;
      auVar187._12_4_ = fVar65 * auVar128._12_4_;
      auVar204._0_4_ = auVar149._0_4_ * fVar87;
      auVar204._4_4_ = auVar149._4_4_ * fVar89;
      auVar204._8_4_ = auVar149._8_4_ * fVar148;
      auVar204._12_4_ = auVar149._12_4_ * fVar65;
      auVar183 = vfmadd231ps_fma(auVar187,auVar274,local_288._0_16_);
      auVar199 = vfmadd231ps_fma(auVar204,(undefined1  [16])0x0,auVar274);
      auVar149 = vshufps_avx(auVar183,auVar183,0xe8);
      auVar150 = vshufps_avx(auVar199,auVar199,0xe8);
      auVar226 = ZEXT1664(auVar150);
      auVar128 = vcmpps_avx(auVar149,auVar150,1);
      uVar58 = vextractps_avx(auVar128,0);
      auVar200 = auVar199;
      if ((uVar58 & 1) == 0) {
        auVar200 = auVar183;
      }
      auVar137 = vmaxss_avx(auVar200,auVar137);
      auVar252 = vminps_avx(auVar252,auVar75);
      auVar75 = vminps_avx(auVar149,auVar150);
      auVar75 = vminps_avx(auVar252,auVar75);
      auVar281 = vshufps_avx(auVar281,auVar281,0x55);
      auVar281 = vblendps_avx(auVar281,auVar128,2);
      auVar128 = vpslld_avx(auVar281,0x1f);
      auVar281 = vshufpd_avx(auVar242,auVar242,1);
      auVar281 = vinsertps_avx(auVar281,auVar199,0x9c);
      auVar252 = vshufpd_avx(auVar138,auVar138,1);
      auVar252 = vinsertps_avx(auVar252,auVar183,0x9c);
      auVar281 = vblendvps_avx(auVar252,auVar281,auVar128);
      auVar252 = vmovshdup_avx(auVar281);
      auVar281 = vmaxss_avx(auVar252,auVar281);
      fVar148 = auVar75._0_4_;
      auVar252 = vmovshdup_avx(auVar75);
      fVar89 = auVar281._0_4_;
      fVar124 = auVar252._0_4_;
      fVar87 = auVar137._0_4_;
      if (((0.0001 <= fVar148) || (fVar89 <= -0.0001)) && (0.0001 <= fVar124 || fVar89 <= -0.0001))
      goto code_r0x015d42ee;
      goto LAB_015d4315;
    }
    local_338 = vinsertps_avx(auVar8,auVar9,0x10);
    goto LAB_015d3a25;
  }
  if (bVar60 != false) {
    return bVar60;
  }
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar82._4_4_ = uVar64;
  auVar82._0_4_ = uVar64;
  auVar82._8_4_ = uVar64;
  auVar82._12_4_ = uVar64;
  auVar8 = vcmpps_avx(local_348,auVar82,2);
  uVar51 = vmovmskps_avx(auVar8);
  uVar51 = (uint)uVar61 & uVar51;
  context = pRVar50;
  if (uVar51 == 0) {
    return false;
  }
  goto LAB_015d3240;
code_r0x015d42ee:
  auVar252 = vcmpps_avx(auVar252,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar138 = vcmpps_avx(auVar75,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar252 = vandps_avx(auVar138,auVar252);
  if (fVar87 <= -0.0001 || (auVar252 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_015d3fd9;
LAB_015d4315:
  auVar138 = vcmpps_avx(auVar75,_DAT_01f7aa10,1);
  auVar242 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar252 = vcmpss_avx(auVar137,ZEXT816(0) << 0x20,1);
  auVar115._8_4_ = 0xbf800000;
  auVar115._0_8_ = 0xbf800000bf800000;
  auVar115._12_4_ = 0xbf800000;
  auVar252 = vblendvps_avx(auVar99,auVar115,auVar252);
  auVar138 = vblendvps_avx(auVar99,auVar115,auVar138);
  fVar228 = auVar138._0_4_;
  fVar65 = auVar252._0_4_;
  auVar252 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar228 == fVar65) && (!NAN(fVar228) && !NAN(fVar65))) {
    auVar252 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar228 == fVar65) && (!NAN(fVar228) && !NAN(fVar65))) {
    auVar242 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar138 = vmovshdup_avx(auVar138);
  fVar261 = auVar138._0_4_;
  if ((fVar228 != fVar261) || (NAN(fVar228) || NAN(fVar261))) {
    auVar188._12_4_ = 0;
    auVar188._0_12_ = ZEXT812(0);
    auVar188 = auVar188 << 0x20;
    if ((fVar124 != fVar148) || (NAN(fVar124) || NAN(fVar148))) {
      auVar129._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
      auVar129._8_4_ = auVar75._8_4_ ^ 0x80000000;
      auVar129._12_4_ = auVar75._12_4_ ^ 0x80000000;
      auVar130._0_4_ = -fVar148 / (fVar124 - fVar148);
      auVar130._4_12_ = auVar129._4_12_;
      auVar75 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar130._0_4_)),auVar188,auVar130);
      auVar138 = auVar75;
    }
    else {
      auVar75 = ZEXT816(0) << 0x20;
      if ((fVar148 != 0.0) || (auVar138 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar148))) {
        auVar75 = SUB6416(ZEXT464(0x7f800000),0);
        auVar138 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar252 = vminss_avx(auVar252,auVar75);
    auVar242 = vmaxss_avx(auVar138,auVar242);
  }
  else {
    auVar43._12_4_ = 0;
    auVar43._0_12_ = ZEXT812(0);
    auVar188 = auVar43 << 0x20;
  }
  auVar281 = vcmpss_avx(auVar281,auVar188,1);
  auVar116._8_4_ = 0xbf800000;
  auVar116._0_8_ = 0xbf800000bf800000;
  auVar116._12_4_ = 0xbf800000;
  auVar281 = vblendvps_avx(auVar99,auVar116,auVar281);
  fVar124 = auVar281._0_4_;
  auVar281 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar65 != fVar124) || (NAN(fVar65) || NAN(fVar124))) {
    if ((fVar89 != fVar87) || (NAN(fVar89) || NAN(fVar87))) {
      auVar76._0_8_ = auVar137._0_8_ ^ 0x8000000080000000;
      auVar76._8_4_ = auVar137._8_4_ ^ 0x80000000;
      auVar76._12_4_ = auVar137._12_4_ ^ 0x80000000;
      auVar131._0_4_ = -fVar87 / (fVar89 - fVar87);
      auVar131._4_12_ = auVar76._4_12_;
      auVar75 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar131._0_4_)),auVar188,auVar131);
      auVar138 = auVar75;
    }
    else {
      auVar75 = ZEXT816(0) << 0x20;
      if ((fVar87 != 0.0) || (auVar138 = auVar281, NAN(fVar87))) {
        auVar75 = SUB6416(ZEXT464(0x7f800000),0);
        auVar138 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar252 = vminss_avx(auVar252,auVar75);
    auVar242 = vmaxss_avx(auVar138,auVar242);
  }
  if ((fVar261 != fVar124) || (NAN(fVar261) || NAN(fVar124))) {
    auVar252 = vminss_avx(auVar252,auVar281);
    auVar242 = vmaxss_avx(auVar281,auVar242);
  }
  auVar252 = vmaxss_avx(auVar188,auVar252);
  auVar75 = vminss_avx(auVar242,auVar281);
  if (auVar75._0_4_ < auVar252._0_4_) goto LAB_015d3fd9;
  auVar252 = vmaxss_avx(auVar188,ZEXT416((uint)(auVar252._0_4_ + -0.1)));
  auVar281 = vminss_avx(ZEXT416((uint)(auVar75._0_4_ + 0.1)),auVar281);
  auVar142._0_8_ = auVar93._0_8_;
  auVar142._8_8_ = auVar142._0_8_;
  auVar218._8_8_ = local_268._0_8_;
  auVar218._0_8_ = local_268._0_8_;
  auVar232._8_8_ = local_288._0_8_;
  auVar232._0_8_ = local_288._0_8_;
  auVar75 = vshufpd_avx(local_268._0_16_,local_268._0_16_,3);
  auVar138 = vshufpd_avx(local_288._0_16_,local_288._0_16_,3);
  auVar242 = vshufps_avx(auVar252,auVar281,0);
  auVar93 = vsubps_avx(auVar99,auVar242);
  local_438._0_4_ = auVar67._0_4_;
  local_438._4_4_ = auVar67._4_4_;
  fStack_430 = auVar67._8_4_;
  fStack_42c = auVar67._12_4_;
  fVar124 = auVar242._0_4_;
  auVar77._0_4_ = fVar124 * (float)local_438._0_4_;
  fVar87 = auVar242._4_4_;
  auVar77._4_4_ = fVar87 * (float)local_438._4_4_;
  fVar89 = auVar242._8_4_;
  auVar77._8_4_ = fVar89 * fStack_430;
  fVar148 = auVar242._12_4_;
  auVar77._12_4_ = fVar148 * fStack_42c;
  auVar177._0_4_ = fVar124 * auVar75._0_4_;
  auVar177._4_4_ = fVar87 * auVar75._4_4_;
  auVar177._8_4_ = fVar89 * auVar75._8_4_;
  auVar177._12_4_ = fVar148 * auVar75._12_4_;
  auVar189._0_4_ = fVar124 * auVar138._0_4_;
  auVar189._4_4_ = fVar87 * auVar138._4_4_;
  auVar189._8_4_ = fVar89 * auVar138._8_4_;
  auVar189._12_4_ = fVar148 * auVar138._12_4_;
  local_418._0_4_ = auVar94._0_4_;
  local_418._4_4_ = auVar94._4_4_;
  fStack_410 = auVar94._8_4_;
  fStack_40c = auVar94._12_4_;
  auVar205._0_4_ = fVar124 * (float)local_418._0_4_;
  auVar205._4_4_ = fVar87 * (float)local_418._4_4_;
  auVar205._8_4_ = fVar89 * fStack_410;
  auVar205._12_4_ = fVar148 * fStack_40c;
  auVar75 = vfmadd231ps_fma(auVar77,auVar93,auVar142);
  auVar138 = vfmadd231ps_fma(auVar177,auVar93,auVar218);
  auVar242 = vfmadd231ps_fma(auVar189,auVar93,auVar232);
  auVar93 = vfmadd231ps_fma(auVar205,auVar93,ZEXT816(0));
  auVar67 = vmovshdup_avx(auVar70);
  auVar183 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar252._0_4_)),auVar70,
                             ZEXT416((uint)(1.0 - auVar252._0_4_)));
  auVar199 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar281._0_4_)),auVar70,
                             ZEXT416((uint)(1.0 - auVar281._0_4_)));
  fVar124 = 1.0 / fVar88;
  auVar281 = vsubps_avx(auVar138,auVar75);
  auVar219._0_4_ = auVar281._0_4_ * 3.0;
  auVar219._4_4_ = auVar281._4_4_ * 3.0;
  auVar219._8_4_ = auVar281._8_4_ * 3.0;
  auVar219._12_4_ = auVar281._12_4_ * 3.0;
  auVar281 = vsubps_avx(auVar242,auVar138);
  auVar233._0_4_ = auVar281._0_4_ * 3.0;
  auVar233._4_4_ = auVar281._4_4_ * 3.0;
  auVar233._8_4_ = auVar281._8_4_ * 3.0;
  auVar233._12_4_ = auVar281._12_4_ * 3.0;
  auVar281 = vsubps_avx(auVar93,auVar242);
  auVar243._0_4_ = auVar281._0_4_ * 3.0;
  auVar243._4_4_ = auVar281._4_4_ * 3.0;
  auVar243._8_4_ = auVar281._8_4_ * 3.0;
  auVar243._12_4_ = auVar281._12_4_ * 3.0;
  auVar67 = vminps_avx(auVar233,auVar243);
  auVar281 = vmaxps_avx(auVar233,auVar243);
  auVar67 = vminps_avx(auVar219,auVar67);
  auVar281 = vmaxps_avx(auVar219,auVar281);
  auVar94 = vshufpd_avx(auVar67,auVar67,3);
  auVar252 = vshufpd_avx(auVar281,auVar281,3);
  auVar67 = vminps_avx(auVar67,auVar94);
  auVar281 = vmaxps_avx(auVar281,auVar252);
  auVar234._0_4_ = auVar67._0_4_ * fVar124;
  auVar234._4_4_ = auVar67._4_4_ * fVar124;
  auVar234._8_4_ = auVar67._8_4_ * fVar124;
  auVar234._12_4_ = auVar67._12_4_ * fVar124;
  auVar220._0_4_ = auVar281._0_4_ * fVar124;
  auVar220._4_4_ = auVar281._4_4_ * fVar124;
  auVar220._8_4_ = auVar281._8_4_ * fVar124;
  auVar220._12_4_ = auVar281._12_4_ * fVar124;
  fVar124 = 1.0 / (auVar199._0_4_ - auVar183._0_4_);
  auVar281 = vshufpd_avx(auVar75,auVar75,3);
  auVar67 = vshufpd_avx(auVar138,auVar138,3);
  auVar94 = vshufpd_avx(auVar242,auVar242,3);
  auVar252 = vshufpd_avx(auVar93,auVar93,3);
  auVar281 = vsubps_avx(auVar281,auVar75);
  auVar75 = vsubps_avx(auVar67,auVar138);
  auVar138 = vsubps_avx(auVar94,auVar242);
  auVar252 = vsubps_avx(auVar252,auVar93);
  auVar67 = vminps_avx(auVar281,auVar75);
  auVar281 = vmaxps_avx(auVar281,auVar75);
  auVar94 = vminps_avx(auVar138,auVar252);
  auVar94 = vminps_avx(auVar67,auVar94);
  auVar67 = vmaxps_avx(auVar138,auVar252);
  auVar281 = vmaxps_avx(auVar281,auVar67);
  auVar265._0_4_ = fVar124 * auVar94._0_4_;
  auVar265._4_4_ = fVar124 * auVar94._4_4_;
  auVar265._8_4_ = fVar124 * auVar94._8_4_;
  auVar265._12_4_ = fVar124 * auVar94._12_4_;
  auVar253._0_4_ = fVar124 * auVar281._0_4_;
  auVar253._4_4_ = fVar124 * auVar281._4_4_;
  auVar253._8_4_ = fVar124 * auVar281._8_4_;
  auVar253._12_4_ = fVar124 * auVar281._12_4_;
  auVar252 = vinsertps_avx(auVar8,auVar183,0x10);
  auVar75 = vinsertps_avx(auVar9,auVar199,0x10);
  auVar244._0_4_ = (auVar252._0_4_ + auVar75._0_4_) * 0.5;
  auVar244._4_4_ = (auVar252._4_4_ + auVar75._4_4_) * 0.5;
  auVar244._8_4_ = (auVar252._8_4_ + auVar75._8_4_) * 0.5;
  auVar244._12_4_ = (auVar252._12_4_ + auVar75._12_4_) * 0.5;
  auVar78._4_4_ = auVar244._0_4_;
  auVar78._0_4_ = auVar244._0_4_;
  auVar78._8_4_ = auVar244._0_4_;
  auVar78._12_4_ = auVar244._0_4_;
  auVar281 = vfmadd213ps_fma(local_298,auVar78,auVar11);
  auVar67 = vfmadd213ps_fma(local_2a8,auVar78,auVar12);
  auVar94 = vfmadd213ps_fma(local_2b8,auVar78,local_3f8);
  auVar9 = vsubps_avx(auVar67,auVar281);
  auVar281 = vfmadd213ps_fma(auVar9,auVar78,auVar281);
  auVar9 = vsubps_avx(auVar94,auVar67);
  auVar9 = vfmadd213ps_fma(auVar9,auVar78,auVar67);
  auVar9 = vsubps_avx(auVar9,auVar281);
  auVar281 = vfmadd231ps_fma(auVar281,auVar9,auVar78);
  auVar79._0_8_ = CONCAT44(auVar9._4_4_ * 3.0,auVar9._0_4_ * 3.0);
  auVar79._8_4_ = auVar9._8_4_ * 3.0;
  auVar79._12_4_ = auVar9._12_4_ * 3.0;
  auVar275._8_8_ = auVar281._0_8_;
  auVar275._0_8_ = auVar281._0_8_;
  auVar9 = vshufpd_avx(auVar281,auVar281,3);
  auVar281 = vshufps_avx(auVar244,auVar244,0x55);
  auVar242 = vsubps_avx(auVar9,auVar275);
  auVar137 = vfmadd231ps_fma(auVar275,auVar281,auVar242);
  auVar282._8_8_ = auVar79._0_8_;
  auVar282._0_8_ = auVar79._0_8_;
  auVar9 = vshufpd_avx(auVar79,auVar79,3);
  auVar9 = vsubps_avx(auVar9,auVar282);
  auVar93 = vfmadd213ps_fma(auVar9,auVar281,auVar282);
  auVar281 = vmovshdup_avx(auVar93);
  auVar283._0_8_ = auVar281._0_8_ ^ 0x8000000080000000;
  auVar283._8_4_ = auVar281._8_4_ ^ 0x80000000;
  auVar283._12_4_ = auVar281._12_4_ ^ 0x80000000;
  auVar67 = vmovshdup_avx(auVar242);
  auVar9 = vunpcklps_avx(auVar67,auVar283);
  auVar94 = vshufps_avx(auVar9,auVar283,4);
  auVar138 = vshufps_avx(auVar244,auVar244,0x54);
  auVar132._0_8_ = auVar242._0_8_ ^ 0x8000000080000000;
  auVar132._8_4_ = auVar242._8_4_ ^ 0x80000000;
  auVar132._12_4_ = auVar242._12_4_ ^ 0x80000000;
  auVar9 = vmovlhps_avx(auVar132,auVar93);
  auVar9 = vshufps_avx(auVar9,auVar93,8);
  auVar281 = vfmsub231ss_fma(ZEXT416((uint)(auVar242._0_4_ * auVar281._0_4_)),auVar67,auVar93);
  uVar64 = auVar281._0_4_;
  auVar80._4_4_ = uVar64;
  auVar80._0_4_ = uVar64;
  auVar80._8_4_ = uVar64;
  auVar80._12_4_ = uVar64;
  auVar281 = vdivps_avx(auVar94,auVar80);
  auVar67 = vdivps_avx(auVar9,auVar80);
  fVar89 = auVar137._0_4_;
  fVar124 = auVar281._0_4_;
  auVar9 = vshufps_avx(auVar137,auVar137,0x55);
  fVar87 = auVar67._0_4_;
  auVar81._0_4_ = fVar89 * fVar124 + auVar9._0_4_ * fVar87;
  auVar81._4_4_ = fVar89 * auVar281._4_4_ + auVar9._4_4_ * auVar67._4_4_;
  auVar81._8_4_ = fVar89 * auVar281._8_4_ + auVar9._8_4_ * auVar67._8_4_;
  auVar81._12_4_ = fVar89 * auVar281._12_4_ + auVar9._12_4_ * auVar67._12_4_;
  auVar150 = vsubps_avx(auVar138,auVar81);
  auVar138 = vmovshdup_avx(auVar281);
  auVar9 = vinsertps_avx(auVar234,auVar265,0x1c);
  auVar156._0_4_ = auVar138._0_4_ * auVar9._0_4_;
  auVar156._4_4_ = auVar138._4_4_ * auVar9._4_4_;
  auVar156._8_4_ = auVar138._8_4_ * auVar9._8_4_;
  auVar156._12_4_ = auVar138._12_4_ * auVar9._12_4_;
  auVar94 = vinsertps_avx(auVar220,auVar253,0x1c);
  auVar100._0_4_ = auVar94._0_4_ * auVar138._0_4_;
  auVar100._4_4_ = auVar94._4_4_ * auVar138._4_4_;
  auVar100._8_4_ = auVar94._8_4_ * auVar138._8_4_;
  auVar100._12_4_ = auVar94._12_4_ * auVar138._12_4_;
  auVar137 = vminps_avx(auVar156,auVar100);
  auVar93 = vmaxps_avx(auVar100,auVar156);
  auVar138 = vinsertps_avx(auVar265,auVar234,0x4c);
  auVar128 = vmovshdup_avx(auVar67);
  auVar242 = vinsertps_avx(auVar253,auVar220,0x4c);
  auVar254._0_4_ = auVar128._0_4_ * auVar138._0_4_;
  auVar254._4_4_ = auVar128._4_4_ * auVar138._4_4_;
  auVar254._8_4_ = auVar128._8_4_ * auVar138._8_4_;
  auVar254._12_4_ = auVar128._12_4_ * auVar138._12_4_;
  auVar235._0_4_ = auVar128._0_4_ * auVar242._0_4_;
  auVar235._4_4_ = auVar128._4_4_ * auVar242._4_4_;
  auVar235._8_4_ = auVar128._8_4_ * auVar242._8_4_;
  auVar235._12_4_ = auVar128._12_4_ * auVar242._12_4_;
  auVar128 = vminps_avx(auVar254,auVar235);
  auVar266._0_4_ = auVar137._0_4_ + auVar128._0_4_;
  auVar266._4_4_ = auVar137._4_4_ + auVar128._4_4_;
  auVar266._8_4_ = auVar137._8_4_ + auVar128._8_4_;
  auVar266._12_4_ = auVar137._12_4_ + auVar128._12_4_;
  auVar137 = vmaxps_avx(auVar235,auVar254);
  auVar101._0_4_ = auVar137._0_4_ + auVar93._0_4_;
  auVar101._4_4_ = auVar137._4_4_ + auVar93._4_4_;
  auVar101._8_4_ = auVar137._8_4_ + auVar93._8_4_;
  auVar101._12_4_ = auVar137._12_4_ + auVar93._12_4_;
  auVar236._8_8_ = 0x3f80000000000000;
  auVar236._0_8_ = 0x3f80000000000000;
  auVar93 = vsubps_avx(auVar236,auVar101);
  auVar137 = vsubps_avx(auVar236,auVar266);
  auVar128 = vsubps_avx(auVar252,auVar244);
  auVar149 = vsubps_avx(auVar75,auVar244);
  auVar117._0_4_ = fVar124 * auVar9._0_4_;
  auVar117._4_4_ = fVar124 * auVar9._4_4_;
  auVar117._8_4_ = fVar124 * auVar9._8_4_;
  auVar117._12_4_ = fVar124 * auVar9._12_4_;
  auVar267._0_4_ = fVar124 * auVar94._0_4_;
  auVar267._4_4_ = fVar124 * auVar94._4_4_;
  auVar267._8_4_ = fVar124 * auVar94._8_4_;
  auVar267._12_4_ = fVar124 * auVar94._12_4_;
  auVar94 = vminps_avx(auVar117,auVar267);
  auVar9 = vmaxps_avx(auVar267,auVar117);
  auVar157._0_4_ = fVar87 * auVar138._0_4_;
  auVar157._4_4_ = fVar87 * auVar138._4_4_;
  auVar157._8_4_ = fVar87 * auVar138._8_4_;
  auVar157._12_4_ = fVar87 * auVar138._12_4_;
  auVar221._0_4_ = fVar87 * auVar242._0_4_;
  auVar221._4_4_ = fVar87 * auVar242._4_4_;
  auVar221._8_4_ = fVar87 * auVar242._8_4_;
  auVar221._12_4_ = fVar87 * auVar242._12_4_;
  auVar138 = vminps_avx(auVar157,auVar221);
  auVar268._0_4_ = auVar94._0_4_ + auVar138._0_4_;
  auVar268._4_4_ = auVar94._4_4_ + auVar138._4_4_;
  auVar268._8_4_ = auVar94._8_4_ + auVar138._8_4_;
  auVar268._12_4_ = auVar94._12_4_ + auVar138._12_4_;
  fVar261 = auVar128._0_4_;
  auVar276._0_4_ = fVar261 * auVar93._0_4_;
  fVar262 = auVar128._4_4_;
  auVar276._4_4_ = fVar262 * auVar93._4_4_;
  fVar193 = auVar128._8_4_;
  auVar276._8_4_ = fVar193 * auVar93._8_4_;
  fVar194 = auVar128._12_4_;
  auVar276._12_4_ = fVar194 * auVar93._12_4_;
  auVar94 = vmaxps_avx(auVar221,auVar157);
  auVar222._0_4_ = fVar261 * auVar137._0_4_;
  auVar222._4_4_ = fVar262 * auVar137._4_4_;
  auVar222._8_4_ = fVar193 * auVar137._8_4_;
  auVar222._12_4_ = fVar194 * auVar137._12_4_;
  fVar89 = auVar149._0_4_;
  auVar102._0_4_ = fVar89 * auVar93._0_4_;
  fVar148 = auVar149._4_4_;
  auVar102._4_4_ = fVar148 * auVar93._4_4_;
  fVar65 = auVar149._8_4_;
  auVar102._8_4_ = fVar65 * auVar93._8_4_;
  fVar228 = auVar149._12_4_;
  auVar102._12_4_ = fVar228 * auVar93._12_4_;
  auVar237._0_4_ = fVar89 * auVar137._0_4_;
  auVar237._4_4_ = fVar148 * auVar137._4_4_;
  auVar237._8_4_ = fVar65 * auVar137._8_4_;
  auVar237._12_4_ = fVar228 * auVar137._12_4_;
  auVar118._0_4_ = auVar9._0_4_ + auVar94._0_4_;
  auVar118._4_4_ = auVar9._4_4_ + auVar94._4_4_;
  auVar118._8_4_ = auVar9._8_4_ + auVar94._8_4_;
  auVar118._12_4_ = auVar9._12_4_ + auVar94._12_4_;
  auVar158._8_8_ = 0x3f800000;
  auVar158._0_8_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar158,auVar118);
  auVar94 = vsubps_avx(auVar158,auVar268);
  auVar269._0_4_ = fVar261 * auVar9._0_4_;
  auVar269._4_4_ = fVar262 * auVar9._4_4_;
  auVar269._8_4_ = fVar193 * auVar9._8_4_;
  auVar269._12_4_ = fVar194 * auVar9._12_4_;
  auVar255._0_4_ = fVar261 * auVar94._0_4_;
  auVar255._4_4_ = fVar262 * auVar94._4_4_;
  auVar255._8_4_ = fVar193 * auVar94._8_4_;
  auVar255._12_4_ = fVar194 * auVar94._12_4_;
  auVar119._0_4_ = fVar89 * auVar9._0_4_;
  auVar119._4_4_ = fVar148 * auVar9._4_4_;
  auVar119._8_4_ = fVar65 * auVar9._8_4_;
  auVar119._12_4_ = fVar228 * auVar9._12_4_;
  auVar159._0_4_ = fVar89 * auVar94._0_4_;
  auVar159._4_4_ = fVar148 * auVar94._4_4_;
  auVar159._8_4_ = fVar65 * auVar94._8_4_;
  auVar159._12_4_ = fVar228 * auVar94._12_4_;
  auVar9 = vminps_avx(auVar269,auVar255);
  auVar94 = vminps_avx(auVar119,auVar159);
  auVar9 = vminps_avx(auVar9,auVar94);
  auVar94 = vmaxps_avx(auVar255,auVar269);
  auVar138 = vmaxps_avx(auVar159,auVar119);
  auVar242 = vminps_avx(auVar276,auVar222);
  auVar93 = vminps_avx(auVar102,auVar237);
  auVar242 = vminps_avx(auVar242,auVar93);
  auVar9 = vhaddps_avx(auVar9,auVar242);
  auVar94 = vmaxps_avx(auVar138,auVar94);
  auVar138 = vmaxps_avx(auVar222,auVar276);
  auVar242 = vmaxps_avx(auVar237,auVar102);
  auVar138 = vmaxps_avx(auVar242,auVar138);
  auVar94 = vhaddps_avx(auVar94,auVar138);
  auVar9 = vshufps_avx(auVar9,auVar9,0xe8);
  auVar94 = vshufps_avx(auVar94,auVar94,0xe8);
  auVar238._0_4_ = auVar150._0_4_ + auVar9._0_4_;
  auVar238._4_4_ = auVar150._4_4_ + auVar9._4_4_;
  auVar238._8_4_ = auVar150._8_4_ + auVar9._8_4_;
  auVar238._12_4_ = auVar150._12_4_ + auVar9._12_4_;
  auVar223._0_4_ = auVar150._0_4_ + auVar94._0_4_;
  auVar223._4_4_ = auVar150._4_4_ + auVar94._4_4_;
  auVar223._8_4_ = auVar150._8_4_ + auVar94._8_4_;
  auVar223._12_4_ = auVar150._12_4_ + auVar94._12_4_;
  auVar226 = ZEXT1664(auVar223);
  auVar9 = vmaxps_avx(auVar252,auVar238);
  auVar94 = vminps_avx(auVar223,auVar75);
  auVar9 = vcmpps_avx(auVar94,auVar9,1);
  auVar9 = vshufps_avx(auVar9,auVar9,0x50);
  if ((auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar9[0xf] < '\0')
  goto LAB_015d3fd9;
  bVar56 = 0;
  if ((auVar192._0_4_ < auVar238._0_4_) && (bVar56 = 0, auVar223._0_4_ < auVar75._0_4_)) {
    auVar94 = vmovshdup_avx(auVar238);
    auVar9 = vcmpps_avx(auVar223,auVar75,1);
    bVar56 = auVar9[4] & auVar183._0_4_ < auVar94._0_4_;
  }
  if (((3 < (uint)uVar53 || fVar88 < 0.001) | bVar56) == 1) {
    lVar55 = 200;
    auVar226 = ZEXT1664(local_3f8);
    do {
      fVar148 = auVar150._0_4_;
      fVar89 = 1.0 - fVar148;
      fVar88 = fVar89 * fVar89 * fVar89;
      fVar90 = fVar148 * 3.0 * fVar89 * fVar89;
      fVar89 = fVar89 * fVar148 * fVar148 * 3.0;
      auVar143._4_4_ = fVar88;
      auVar143._0_4_ = fVar88;
      auVar143._8_4_ = fVar88;
      auVar143._12_4_ = fVar88;
      auVar120._4_4_ = fVar90;
      auVar120._0_4_ = fVar90;
      auVar120._8_4_ = fVar90;
      auVar120._12_4_ = fVar90;
      auVar103._4_4_ = fVar89;
      auVar103._0_4_ = fVar89;
      auVar103._8_4_ = fVar89;
      auVar103._12_4_ = fVar89;
      fVar148 = fVar148 * fVar148 * fVar148;
      auVar160._0_4_ = (float)local_2c8._0_4_ * fVar148;
      auVar160._4_4_ = (float)local_2c8._4_4_ * fVar148;
      auVar160._8_4_ = fStack_2c0 * fVar148;
      auVar160._12_4_ = fStack_2bc * fVar148;
      auVar8 = vfmadd231ps_fma(auVar160,local_3f8,auVar103);
      auVar8 = vfmadd231ps_fma(auVar8,auVar12,auVar120);
      auVar8 = vfmadd231ps_fma(auVar8,auVar11,auVar143);
      auVar104._8_8_ = auVar8._0_8_;
      auVar104._0_8_ = auVar8._0_8_;
      auVar8 = vshufpd_avx(auVar8,auVar8,3);
      auVar9 = vshufps_avx(auVar150,auVar150,0x55);
      auVar8 = vsubps_avx(auVar8,auVar104);
      auVar9 = vfmadd213ps_fma(auVar8,auVar9,auVar104);
      fVar88 = auVar9._0_4_;
      auVar8 = vshufps_avx(auVar9,auVar9,0x55);
      auVar105._0_4_ = fVar124 * fVar88 + fVar87 * auVar8._0_4_;
      auVar105._4_4_ = auVar281._4_4_ * fVar88 + auVar67._4_4_ * auVar8._4_4_;
      auVar105._8_4_ = auVar281._8_4_ * fVar88 + auVar67._8_4_ * auVar8._8_4_;
      auVar105._12_4_ = auVar281._12_4_ * fVar88 + auVar67._12_4_ * auVar8._12_4_;
      auVar150 = vsubps_avx(auVar150,auVar105);
      auVar8 = vandps_avx(auVar248,auVar9);
      auVar9 = vshufps_avx(auVar8,auVar8,0xf5);
      auVar8 = vmaxss_avx(auVar9,auVar8);
      if (auVar8._0_4_ < fVar86) {
        local_1b8 = auVar150._0_4_;
        if ((0.0 <= local_1b8) && (local_1b8 <= 1.0)) {
          auVar8 = vmovshdup_avx(auVar150);
          fVar88 = auVar8._0_4_;
          if ((0.0 <= fVar88) && (fVar88 <= 1.0)) {
            auVar8 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                   ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
            auVar138 = vinsertps_avx(auVar8,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28
                                    );
            auVar8 = vdpps_avx(auVar138,local_448,0x7f);
            auVar9 = vdpps_avx(auVar138,local_458,0x7f);
            auVar281 = vdpps_avx(auVar138,local_2d8,0x7f);
            auVar67 = vdpps_avx(auVar138,local_2e8,0x7f);
            auVar94 = vdpps_avx(auVar138,local_2f8,0x7f);
            auVar252 = vdpps_avx(auVar138,local_308,0x7f);
            auVar75 = vdpps_avx(auVar138,local_318,0x7f);
            auVar138 = vdpps_avx(auVar138,local_328,0x7f);
            fVar90 = 1.0 - fVar88;
            auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar88 * auVar94._0_4_)),ZEXT416((uint)fVar90),
                                     auVar8);
            auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar252._0_4_ * fVar88)),ZEXT416((uint)fVar90),
                                     auVar9);
            auVar281 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * fVar88)),ZEXT416((uint)fVar90)
                                       ,auVar281);
            auVar226 = ZEXT1664(auVar281);
            auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar88 * auVar138._0_4_)),ZEXT416((uint)fVar90)
                                      ,auVar67);
            fVar87 = 1.0 - local_1b8;
            fVar88 = fVar87 * local_1b8 * local_1b8 * 3.0;
            fVar148 = local_1b8 * local_1b8 * local_1b8;
            auVar281 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * fVar148)),
                                       ZEXT416((uint)fVar88),auVar281);
            fVar90 = local_1b8 * 3.0 * fVar87 * fVar87;
            auVar9 = vfmadd231ss_fma(auVar281,ZEXT416((uint)fVar90),auVar9);
            fVar124 = fVar87 * fVar87 * fVar87;
            auVar8 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar124),auVar8);
            fVar89 = auVar8._0_4_;
            if ((fVar63 <= fVar89) && (fVar65 = *(float *)(ray + k * 4 + 0x80), fVar89 <= fVar65)) {
              pGVar4 = (pRVar50->scene->geometries).items[uVar51].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                bVar62 = false;
              }
              else if ((pRVar50->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar62 = true, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_1a8 = vshufps_avx(auVar150,auVar150,0x55);
                auVar206._8_4_ = 0x3f800000;
                auVar206._0_8_ = 0x3f8000003f800000;
                auVar206._12_4_ = 0x3f800000;
                auVar8 = vsubps_avx(auVar206,local_1a8);
                fVar228 = local_1a8._0_4_;
                auVar224._0_4_ = fVar228 * (float)local_478._0_4_;
                fVar261 = local_1a8._4_4_;
                auVar224._4_4_ = fVar261 * (float)local_478._4_4_;
                fVar262 = local_1a8._8_4_;
                auVar224._8_4_ = fVar262 * fStack_470;
                fVar193 = local_1a8._12_4_;
                auVar224._12_4_ = fVar193 * fStack_46c;
                auVar239._0_4_ = fVar228 * (float)local_4b8._0_4_;
                auVar239._4_4_ = fVar261 * (float)local_4b8._4_4_;
                auVar239._8_4_ = fVar262 * fStack_4b0;
                auVar239._12_4_ = fVar193 * fStack_4ac;
                auVar245._0_4_ = fVar228 * (float)local_4c8._0_4_;
                auVar245._4_4_ = fVar261 * (float)local_4c8._4_4_;
                auVar245._8_4_ = fVar262 * fStack_4c0;
                auVar245._12_4_ = fVar193 * fStack_4bc;
                auVar256._0_4_ = fVar228 * fVar163;
                auVar256._4_4_ = fVar261 * fVar180;
                auVar256._8_4_ = fVar262 * fVar181;
                auVar256._12_4_ = fVar193 * fVar182;
                auVar9 = vfmadd231ps_fma(auVar224,auVar8,local_468);
                auVar281 = vfmadd231ps_fma(auVar239,auVar8,local_498);
                auVar67 = vfmadd231ps_fma(auVar245,auVar8,local_4a8);
                auVar94 = vfmadd231ps_fma(auVar256,auVar8,local_488);
                auVar8 = vsubps_avx(auVar281,auVar9);
                auVar9 = vsubps_avx(auVar67,auVar281);
                auVar226 = ZEXT1664(auVar9);
                auVar281 = vsubps_avx(auVar94,auVar67);
                auVar246._0_4_ = auVar9._0_4_ * local_1b8;
                auVar246._4_4_ = auVar9._4_4_ * local_1b8;
                auVar246._8_4_ = auVar9._8_4_ * local_1b8;
                auVar246._12_4_ = auVar9._12_4_ * local_1b8;
                auVar178._4_4_ = fVar87;
                auVar178._0_4_ = fVar87;
                auVar178._8_4_ = fVar87;
                auVar178._12_4_ = fVar87;
                auVar8 = vfmadd231ps_fma(auVar246,auVar178,auVar8);
                auVar207._0_4_ = auVar281._0_4_ * local_1b8;
                auVar207._4_4_ = auVar281._4_4_ * local_1b8;
                auVar207._8_4_ = auVar281._8_4_ * local_1b8;
                auVar207._12_4_ = auVar281._12_4_ * local_1b8;
                auVar281 = vfmadd231ps_fma(auVar207,auVar178,auVar9);
                auVar208._0_4_ = auVar281._0_4_ * local_1b8;
                auVar208._4_4_ = auVar281._4_4_ * local_1b8;
                auVar208._8_4_ = auVar281._8_4_ * local_1b8;
                auVar208._12_4_ = auVar281._12_4_ * local_1b8;
                auVar281 = vfmadd231ps_fma(auVar208,auVar178,auVar8);
                auVar161._0_4_ = fVar148 * (float)local_3a8._0_4_;
                auVar161._4_4_ = fVar148 * (float)local_3a8._4_4_;
                auVar161._8_4_ = fVar148 * fStack_3a0;
                auVar161._12_4_ = fVar148 * fStack_39c;
                auVar121._4_4_ = fVar88;
                auVar121._0_4_ = fVar88;
                auVar121._8_4_ = fVar88;
                auVar121._12_4_ = fVar88;
                auVar8 = vfmadd132ps_fma(auVar121,auVar161,local_398);
                auVar144._4_4_ = fVar90;
                auVar144._0_4_ = fVar90;
                auVar144._8_4_ = fVar90;
                auVar144._12_4_ = fVar90;
                auVar8 = vfmadd132ps_fma(auVar144,auVar8,local_388);
                auVar122._0_4_ = auVar281._0_4_ * 3.0;
                auVar122._4_4_ = auVar281._4_4_ * 3.0;
                auVar122._8_4_ = auVar281._8_4_ * 3.0;
                auVar122._12_4_ = auVar281._12_4_ * 3.0;
                auVar133._4_4_ = fVar124;
                auVar133._0_4_ = fVar124;
                auVar133._8_4_ = fVar124;
                auVar133._12_4_ = fVar124;
                auVar281 = vfmadd132ps_fma(auVar133,auVar8,local_378);
                auVar8 = vshufps_avx(auVar122,auVar122,0xc9);
                auVar145._0_4_ = auVar281._0_4_ * auVar8._0_4_;
                auVar145._4_4_ = auVar281._4_4_ * auVar8._4_4_;
                auVar145._8_4_ = auVar281._8_4_ * auVar8._8_4_;
                auVar145._12_4_ = auVar281._12_4_ * auVar8._12_4_;
                auVar8 = vshufps_avx(auVar281,auVar281,0xc9);
                auVar281 = vfmsub231ps_fma(auVar145,auVar122,auVar8);
                auVar8 = vshufps_avx(auVar281,auVar281,0x55);
                local_1e8[0] = (RTCHitN)auVar8[0];
                local_1e8[1] = (RTCHitN)auVar8[1];
                local_1e8[2] = (RTCHitN)auVar8[2];
                local_1e8[3] = (RTCHitN)auVar8[3];
                local_1e8[4] = (RTCHitN)auVar8[4];
                local_1e8[5] = (RTCHitN)auVar8[5];
                local_1e8[6] = (RTCHitN)auVar8[6];
                local_1e8[7] = (RTCHitN)auVar8[7];
                local_1e8[8] = (RTCHitN)auVar8[8];
                local_1e8[9] = (RTCHitN)auVar8[9];
                local_1e8[10] = (RTCHitN)auVar8[10];
                local_1e8[0xb] = (RTCHitN)auVar8[0xb];
                local_1e8[0xc] = (RTCHitN)auVar8[0xc];
                local_1e8[0xd] = (RTCHitN)auVar8[0xd];
                local_1e8[0xe] = (RTCHitN)auVar8[0xe];
                local_1e8[0xf] = (RTCHitN)auVar8[0xf];
                local_1d8 = vshufps_avx(auVar281,auVar281,0xaa);
                local_1c8 = auVar281._0_4_;
                uStack_1c4 = local_1c8;
                uStack_1c0 = local_1c8;
                uStack_1bc = local_1c8;
                fStack_1b4 = local_1b8;
                fStack_1b0 = local_1b8;
                fStack_1ac = local_1b8;
                local_198 = CONCAT44(uStack_364,local_368);
                uStack_190 = CONCAT44(uStack_35c,uStack_360);
                local_188._4_4_ = uStack_354;
                local_188._0_4_ = local_358;
                local_188._8_4_ = uStack_350;
                local_188._12_4_ = uStack_34c;
                vpcmpeqd_avx2(ZEXT1632(local_188),ZEXT1632(local_188));
                uStack_174 = pRVar50->user->instID[0];
                local_178 = uStack_174;
                uStack_170 = uStack_174;
                uStack_16c = uStack_174;
                uStack_168 = pRVar50->user->instPrimID[0];
                uStack_164 = uStack_168;
                uStack_160 = uStack_168;
                uStack_15c = uStack_168;
                *(float *)(ray + k * 4 + 0x80) = fVar89;
                local_508 = *local_4f8;
                local_3d8.valid = (int *)local_508;
                local_3d8.geometryUserPtr = pGVar4->userPtr;
                local_3d8.context = pRVar50->user;
                local_3d8.ray = (RTCRayN *)ray;
                local_3d8.hit = local_1e8;
                local_3d8.N = 4;
                if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar226 = ZEXT1664(auVar9);
                  (*pGVar4->occlusionFilterN)(&local_3d8);
                }
                if (local_508 == (undefined1  [16])0x0) {
                  auVar8 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar8 = auVar8 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var5 = pRVar50->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((pRVar50->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar226 = ZEXT1664(auVar226._0_16_);
                    (*p_Var5)(&local_3d8);
                  }
                  auVar9 = vpcmpeqd_avx(local_508,_DAT_01f7aa10);
                  auVar8 = auVar9 ^ _DAT_01f7ae20;
                  auVar123._8_4_ = 0xff800000;
                  auVar123._0_8_ = 0xff800000ff800000;
                  auVar123._12_4_ = 0xff800000;
                  auVar9 = vblendvps_avx(auVar123,*(undefined1 (*) [16])(local_3d8.ray + 0x80),
                                         auVar9);
                  *(undefined1 (*) [16])(local_3d8.ray + 0x80) = auVar9;
                }
                auVar106._8_8_ = 0x100000001;
                auVar106._0_8_ = 0x100000001;
                bVar62 = (auVar106 & auVar8) != (undefined1  [16])0x0;
                if (!bVar62) {
                  *(float *)(ray + k * 4 + 0x80) = fVar65;
                }
              }
              bVar60 = (bool)(bVar60 | bVar62);
            }
          }
        }
        break;
      }
      lVar55 = lVar55 + -1;
    } while (lVar55 != 0);
    goto LAB_015d3fd9;
  }
  local_338 = vinsertps_avx(auVar8,ZEXT416((uint)fVar90),0x10);
  auVar70 = vinsertps_avx(auVar183,ZEXT416((uint)auVar199._0_4_),0x10);
  goto LAB_015d3a25;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }